

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [60];
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  long lVar59;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  ulong uVar60;
  uint uVar61;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar75 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  int iVar124;
  float t1;
  float fVar125;
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined4 uVar130;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vfloat4 a0_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vfloat4 b0;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  vfloat4 a0_3;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  __m128 a_1;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  float fVar224;
  float fVar225;
  __m128 a;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar234;
  float fVar244;
  float fVar245;
  vfloat4 a0_1;
  undefined1 auVar235 [16];
  float fVar246;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar247;
  float fVar252;
  float fVar253;
  vfloat4 a0;
  undefined1 auVar248 [16];
  float fVar254;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  int iVar269;
  undefined1 in_ZMM30 [64];
  undefined1 auVar270 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  uint auStack_5b0 [4];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar55;
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  
  PVar4 = prim[1];
  uVar58 = (ulong)(byte)PVar4;
  fVar150 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar62 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar63 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar65 = vsubps_avx(auVar62,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  fVar149 = fVar150 * auVar65._0_4_;
  fVar125 = fVar150 * auVar63._0_4_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + uVar58 * 4 + 6);
  auVar95 = vpmovsxbd_avx2(auVar62);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar58 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar71);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar58 * 6 + 6);
  auVar106 = vpmovsxbd_avx2(auVar3);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar73);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar96 = vcvtdq2ps_avx(auVar100);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar58 + 6);
  auVar94 = vpmovsxbd_avx2(auVar68);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar60 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar97 = vpmovsxbd_avx2(auVar74);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 + uVar58 + 6);
  auVar98 = vpmovsxbd_avx2(auVar76);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar54 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar54 + 6);
  auVar92 = vpmovsxbd_avx2(auVar64);
  auVar99 = vcvtdq2ps_avx(auVar92);
  auVar165._4_4_ = fVar125;
  auVar165._0_4_ = fVar125;
  auVar165._8_4_ = fVar125;
  auVar165._12_4_ = fVar125;
  auVar165._16_4_ = fVar125;
  auVar165._20_4_ = fVar125;
  auVar165._24_4_ = fVar125;
  auVar165._28_4_ = fVar125;
  auVar261._8_4_ = 1;
  auVar261._0_8_ = 0x100000001;
  auVar261._12_4_ = 1;
  auVar261._16_4_ = 1;
  auVar261._20_4_ = 1;
  auVar261._24_4_ = 1;
  auVar261._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar268 = ZEXT3264(auVar90);
  auVar102 = ZEXT1632(CONCAT412(fVar150 * auVar63._12_4_,
                                CONCAT48(fVar150 * auVar63._8_4_,
                                         CONCAT44(fVar150 * auVar63._4_4_,fVar125))));
  auVar101 = vpermps_avx2(auVar261,auVar102);
  auVar91 = vpermps_avx512vl(auVar90,auVar102);
  fVar125 = auVar91._0_4_;
  fVar211 = auVar91._4_4_;
  auVar102._4_4_ = fVar211 * auVar106._4_4_;
  auVar102._0_4_ = fVar125 * auVar106._0_4_;
  fVar224 = auVar91._8_4_;
  auVar102._8_4_ = fVar224 * auVar106._8_4_;
  fVar225 = auVar91._12_4_;
  auVar102._12_4_ = fVar225 * auVar106._12_4_;
  fVar128 = auVar91._16_4_;
  auVar102._16_4_ = fVar128 * auVar106._16_4_;
  fVar129 = auVar91._20_4_;
  auVar102._20_4_ = fVar129 * auVar106._20_4_;
  fVar226 = auVar91._24_4_;
  auVar102._24_4_ = fVar226 * auVar106._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar94._4_4_ * fVar211;
  auVar100._0_4_ = auVar94._0_4_ * fVar125;
  auVar100._8_4_ = auVar94._8_4_ * fVar224;
  auVar100._12_4_ = auVar94._12_4_ * fVar225;
  auVar100._16_4_ = auVar94._16_4_ * fVar128;
  auVar100._20_4_ = auVar94._20_4_ * fVar129;
  auVar100._24_4_ = auVar94._24_4_ * fVar226;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar211;
  auVar92._0_4_ = auVar99._0_4_ * fVar125;
  auVar92._8_4_ = auVar99._8_4_ * fVar224;
  auVar92._12_4_ = auVar99._12_4_ * fVar225;
  auVar92._16_4_ = auVar99._16_4_ * fVar128;
  auVar92._20_4_ = auVar99._20_4_ * fVar129;
  auVar92._24_4_ = auVar99._24_4_ * fVar226;
  auVar92._28_4_ = auVar91._28_4_;
  auVar62 = vfmadd231ps_fma(auVar102,auVar101,auVar93);
  auVar71 = vfmadd231ps_fma(auVar100,auVar101,auVar96);
  auVar3 = vfmadd231ps_fma(auVar92,auVar98,auVar101);
  auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar165,auVar95);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar165,auVar107);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar97,auVar165);
  auVar251._4_4_ = fVar149;
  auVar251._0_4_ = fVar149;
  auVar251._8_4_ = fVar149;
  auVar251._12_4_ = fVar149;
  auVar251._16_4_ = fVar149;
  auVar251._20_4_ = fVar149;
  auVar251._24_4_ = fVar149;
  auVar251._28_4_ = fVar149;
  auVar92 = ZEXT1632(CONCAT412(fVar150 * auVar65._12_4_,
                               CONCAT48(fVar150 * auVar65._8_4_,
                                        CONCAT44(fVar150 * auVar65._4_4_,fVar149))));
  auVar100 = vpermps_avx2(auVar261,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar150 = auVar92._0_4_;
  fVar125 = auVar92._4_4_;
  auVar101._4_4_ = fVar125 * auVar106._4_4_;
  auVar101._0_4_ = fVar150 * auVar106._0_4_;
  fVar211 = auVar92._8_4_;
  auVar101._8_4_ = fVar211 * auVar106._8_4_;
  fVar224 = auVar92._12_4_;
  auVar101._12_4_ = fVar224 * auVar106._12_4_;
  fVar225 = auVar92._16_4_;
  auVar101._16_4_ = fVar225 * auVar106._16_4_;
  fVar128 = auVar92._20_4_;
  auVar101._20_4_ = fVar128 * auVar106._20_4_;
  fVar129 = auVar92._24_4_;
  auVar101._24_4_ = fVar129 * auVar106._24_4_;
  auVar101._28_4_ = 1;
  auVar90._4_4_ = auVar94._4_4_ * fVar125;
  auVar90._0_4_ = auVar94._0_4_ * fVar150;
  auVar90._8_4_ = auVar94._8_4_ * fVar211;
  auVar90._12_4_ = auVar94._12_4_ * fVar224;
  auVar90._16_4_ = auVar94._16_4_ * fVar225;
  auVar90._20_4_ = auVar94._20_4_ * fVar128;
  auVar90._24_4_ = auVar94._24_4_ * fVar129;
  auVar90._28_4_ = auVar106._28_4_;
  auVar94._4_4_ = auVar99._4_4_ * fVar125;
  auVar94._0_4_ = auVar99._0_4_ * fVar150;
  auVar94._8_4_ = auVar99._8_4_ * fVar211;
  auVar94._12_4_ = auVar99._12_4_ * fVar224;
  auVar94._16_4_ = auVar99._16_4_ * fVar225;
  auVar94._20_4_ = auVar99._20_4_ * fVar128;
  auVar94._24_4_ = auVar99._24_4_ * fVar129;
  auVar94._28_4_ = auVar92._28_4_;
  auVar72 = vfmadd231ps_fma(auVar101,auVar100,auVar93);
  auVar73 = vfmadd231ps_fma(auVar90,auVar100,auVar96);
  auVar68 = vfmadd231ps_fma(auVar94,auVar100,auVar98);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar251,auVar95);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar251,auVar107);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar251,auVar97);
  auVar95 = vandps_avx(ZEXT1632(auVar62),auVar109);
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  auVar158._16_4_ = 0x219392ef;
  auVar158._20_4_ = 0x219392ef;
  auVar158._24_4_ = 0x219392ef;
  auVar158._28_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar95,auVar158,1);
  bVar11 = (bool)((byte)uVar60 & 1);
  auVar91._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._0_4_;
  bVar11 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._4_4_;
  bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._8_4_;
  bVar11 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar62._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar71),auVar109);
  uVar60 = vcmpps_avx512vl(auVar95,auVar158,1);
  bVar11 = (bool)((byte)uVar60 & 1);
  auVar103._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar71._0_4_;
  bVar11 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar71._4_4_;
  bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar71._8_4_;
  bVar11 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar71._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar95 = vandps_avx(ZEXT1632(auVar3),auVar109);
  uVar60 = vcmpps_avx512vl(auVar95,auVar158,1);
  bVar11 = (bool)((byte)uVar60 & 1);
  auVar95._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._0_4_;
  bVar11 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._4_4_;
  bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._8_4_;
  bVar11 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar3._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar60 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = &DAT_3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar62 = vfnmadd213ps_fma(auVar91,auVar93,auVar110);
  auVar62 = vfmadd132ps_fma(ZEXT1632(auVar62),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar103);
  auVar71 = vfnmadd213ps_fma(auVar103,auVar93,auVar110);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar95);
  auVar3 = vfnmadd213ps_fma(auVar95,auVar93,auVar110);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar93,auVar93);
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 7 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar72));
  auVar97._4_4_ = auVar62._4_4_ * auVar95._4_4_;
  auVar97._0_4_ = auVar62._0_4_ * auVar95._0_4_;
  auVar97._8_4_ = auVar62._8_4_ * auVar95._8_4_;
  auVar97._12_4_ = auVar62._12_4_ * auVar95._12_4_;
  auVar97._16_4_ = auVar95._16_4_ * 0.0;
  auVar97._20_4_ = auVar95._20_4_ * 0.0;
  auVar97._24_4_ = auVar95._24_4_ * 0.0;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 9 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar72));
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar108._0_4_ = auVar62._0_4_ * auVar95._0_4_;
  auVar108._4_4_ = auVar62._4_4_ * auVar95._4_4_;
  auVar108._8_4_ = auVar62._8_4_ * auVar95._8_4_;
  auVar108._12_4_ = auVar62._12_4_ * auVar95._12_4_;
  auVar108._16_4_ = auVar95._16_4_ * 0.0;
  auVar108._20_4_ = auVar95._20_4_ * 0.0;
  auVar108._24_4_ = auVar95._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar58 * -2 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar73));
  auVar98._4_4_ = auVar71._4_4_ * auVar95._4_4_;
  auVar98._0_4_ = auVar71._0_4_ * auVar95._0_4_;
  auVar98._8_4_ = auVar71._8_4_ * auVar95._8_4_;
  auVar98._12_4_ = auVar71._12_4_ * auVar95._12_4_;
  auVar98._16_4_ = auVar95._16_4_ * 0.0;
  auVar98._20_4_ = auVar95._20_4_ * 0.0;
  auVar98._24_4_ = auVar95._24_4_ * 0.0;
  auVar98._28_4_ = auVar95._28_4_;
  auVar95 = vcvtdq2ps_avx(auVar93);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar73));
  auVar105._0_4_ = auVar71._0_4_ * auVar95._0_4_;
  auVar105._4_4_ = auVar71._4_4_ * auVar95._4_4_;
  auVar105._8_4_ = auVar71._8_4_ * auVar95._8_4_;
  auVar105._12_4_ = auVar71._12_4_ * auVar95._12_4_;
  auVar105._16_4_ = auVar95._16_4_ * 0.0;
  auVar105._20_4_ = auVar95._20_4_ * 0.0;
  auVar105._24_4_ = auVar95._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar54 + uVar58 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar68));
  auVar99._4_4_ = auVar95._4_4_ * auVar3._4_4_;
  auVar99._0_4_ = auVar95._0_4_ * auVar3._0_4_;
  auVar99._8_4_ = auVar95._8_4_ * auVar3._8_4_;
  auVar99._12_4_ = auVar95._12_4_ * auVar3._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar95 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar58 * 0x17 + 6));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar68));
  auVar104._0_4_ = auVar3._0_4_ * auVar95._0_4_;
  auVar104._4_4_ = auVar3._4_4_ * auVar95._4_4_;
  auVar104._8_4_ = auVar3._8_4_ * auVar95._8_4_;
  auVar104._12_4_ = auVar3._12_4_ * auVar95._12_4_;
  auVar104._16_4_ = auVar95._16_4_ * 0.0;
  auVar104._20_4_ = auVar95._20_4_ * 0.0;
  auVar104._24_4_ = auVar95._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar95 = vpminsd_avx2(auVar97,auVar108);
  auVar93 = vpminsd_avx2(auVar98,auVar105);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93 = vpminsd_avx2(auVar99,auVar104);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar106._4_4_ = uVar130;
  auVar106._0_4_ = uVar130;
  auVar106._8_4_ = uVar130;
  auVar106._12_4_ = uVar130;
  auVar106._16_4_ = uVar130;
  auVar106._20_4_ = uVar130;
  auVar106._24_4_ = uVar130;
  auVar106._28_4_ = uVar130;
  auVar93 = vmaxps_avx512vl(auVar93,auVar106);
  auVar95 = vmaxps_avx(auVar95,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar95,auVar93);
  auVar95 = vpmaxsd_avx2(auVar97,auVar108);
  auVar93 = vpmaxsd_avx2(auVar98,auVar105);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar93 = vpmaxsd_avx2(auVar99,auVar104);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar107._4_4_ = uVar130;
  auVar107._0_4_ = uVar130;
  auVar107._8_4_ = uVar130;
  auVar107._12_4_ = uVar130;
  auVar107._16_4_ = uVar130;
  auVar107._20_4_ = uVar130;
  auVar107._24_4_ = uVar130;
  auVar107._28_4_ = uVar130;
  auVar93 = vminps_avx512vl(auVar93,auVar107);
  auVar95 = vminps_avx(auVar95,auVar93);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar96);
  uVar28 = vpcmpgtd_avx512vl(auVar94,_DAT_0205a920);
  uVar27 = vcmpps_avx512vl(local_400,auVar95,2);
  if ((byte)((byte)uVar27 & (byte)uVar28) == 0) {
    return;
  }
  uVar60 = (ulong)(byte)((byte)uVar27 & (byte)uVar28);
  auVar127 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar127);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar127 = ZEXT1664(auVar62);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar62);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar265 = ZEXT1664(auVar62);
  auVar62 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar270 = ZEXT1664(auVar62);
LAB_01da0441:
  lVar59 = 0;
  for (uVar54 = uVar60; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar59 = lVar59 + 1;
  }
  uVar61 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar59 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar61].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar5 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar62 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar54);
  lVar59 = uVar54 + 1;
  auVar71 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar59);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar54);
  auVar72 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar59);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  fVar150 = *(float *)(ray + k * 4 + 0xc0);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar64 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar54),
                       auVar62,auVar63);
  auVar65 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar59),
                       auVar71,auVar63);
  auVar66 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar54 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar3,auVar63);
  auVar67 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar59),
                       auVar72,auVar63);
  auVar131 = ZEXT816(0) << 0x40;
  auVar70._0_4_ = auVar71._0_4_ * 0.0;
  auVar70._4_4_ = auVar71._4_4_ * 0.0;
  auVar70._8_4_ = auVar71._8_4_ * 0.0;
  auVar70._12_4_ = auVar71._12_4_ * 0.0;
  auVar74 = vfmadd231ps_fma(auVar70,auVar65,auVar131);
  auVar68 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar64,auVar74);
  auVar75._0_4_ = auVar62._0_4_ + auVar68._0_4_;
  auVar75._4_4_ = auVar62._4_4_ + auVar68._4_4_;
  auVar75._8_4_ = auVar62._8_4_ + auVar68._8_4_;
  auVar75._12_4_ = auVar62._12_4_ + auVar68._12_4_;
  auVar79 = auVar127._0_16_;
  auVar68 = vfmadd231ps_avx512vl(auVar74,auVar64,auVar79);
  auVar69 = vfnmadd231ps_avx512vl(auVar68,auVar62,auVar79);
  auVar235._0_4_ = auVar72._0_4_ * 0.0;
  auVar235._4_4_ = auVar72._4_4_ * 0.0;
  auVar235._8_4_ = auVar72._8_4_ * 0.0;
  auVar235._12_4_ = auVar72._12_4_ * 0.0;
  auVar74 = vfmadd231ps_fma(auVar235,auVar67,auVar131);
  auVar68 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar66,auVar74);
  auVar248._0_4_ = auVar3._0_4_ + auVar68._0_4_;
  auVar248._4_4_ = auVar3._4_4_ + auVar68._4_4_;
  auVar248._8_4_ = auVar3._8_4_ + auVar68._8_4_;
  auVar248._12_4_ = auVar3._12_4_ + auVar68._12_4_;
  auVar68 = vfmadd231ps_avx512vl(auVar74,auVar66,auVar79);
  auVar70 = vfnmadd231ps_avx512vl(auVar68,auVar3,auVar79);
  auVar68 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar65,auVar71);
  auVar68 = vfmadd231ps_fma(auVar68,auVar64,auVar131);
  auVar76 = vfmadd231ps_fma(auVar68,auVar62,auVar131);
  auVar71 = vmulps_avx512vl(auVar71,auVar79);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar79,auVar65);
  auVar71 = vfmadd231ps_fma(auVar71,auVar131,auVar64);
  auVar64 = vfnmadd231ps_fma(auVar71,auVar131,auVar62);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar67,auVar72);
  auVar62 = vfmadd231ps_fma(auVar62,auVar66,auVar131);
  auVar68 = vfmadd231ps_fma(auVar62,auVar3,auVar131);
  auVar62 = vmulps_avx512vl(auVar72,auVar79);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar79,auVar67);
  auVar62 = vfmadd231ps_fma(auVar62,auVar131,auVar66);
  auVar74 = vfnmadd231ps_fma(auVar62,auVar131,auVar3);
  auVar62 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar71 = vshufps_avx(auVar248,auVar248,0xc9);
  fVar227 = auVar69._0_4_;
  auVar179._0_4_ = fVar227 * auVar71._0_4_;
  fVar140 = auVar69._4_4_;
  auVar179._4_4_ = fVar140 * auVar71._4_4_;
  fVar141 = auVar69._8_4_;
  auVar179._8_4_ = fVar141 * auVar71._8_4_;
  fVar142 = auVar69._12_4_;
  auVar179._12_4_ = fVar142 * auVar71._12_4_;
  auVar71 = vfmsub231ps_fma(auVar179,auVar62,auVar248);
  auVar3 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar203._0_4_ = auVar71._0_4_ * fVar227;
  auVar203._4_4_ = auVar71._4_4_ * fVar140;
  auVar203._8_4_ = auVar71._8_4_ * fVar141;
  auVar203._12_4_ = auVar71._12_4_ * fVar142;
  auVar62 = vfmsub231ps_fma(auVar203,auVar62,auVar70);
  auVar72 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar71 = vshufps_avx(auVar68,auVar68,0xc9);
  fVar125 = auVar64._0_4_;
  auVar212._0_4_ = auVar71._0_4_ * fVar125;
  fVar211 = auVar64._4_4_;
  auVar212._4_4_ = auVar71._4_4_ * fVar211;
  fVar224 = auVar64._8_4_;
  auVar212._8_4_ = auVar71._8_4_ * fVar224;
  fVar225 = auVar64._12_4_;
  auVar212._12_4_ = auVar71._12_4_ * fVar225;
  auVar71 = vfmsub231ps_fma(auVar212,auVar62,auVar68);
  auVar68 = vshufps_avx(auVar71,auVar71,0xc9);
  auVar71 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar213._0_4_ = auVar71._0_4_ * fVar125;
  auVar213._4_4_ = auVar71._4_4_ * fVar211;
  auVar213._8_4_ = auVar71._8_4_ * fVar224;
  auVar213._12_4_ = auVar71._12_4_ * fVar225;
  auVar62 = vfmsub231ps_fma(auVar213,auVar62,auVar74);
  auVar74 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar62 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar128 = auVar62._0_4_;
  auVar214._4_12_ = ZEXT812(0) << 0x20;
  auVar214._0_4_ = fVar128;
  auVar71 = vrsqrt14ss_avx512f(auVar131,auVar214);
  auVar65 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  fVar129 = auVar71._0_4_;
  fVar226 = auVar65._0_4_ - auVar66._0_4_ * fVar129 * fVar129 * fVar129;
  auVar71 = vdpps_avx(auVar3,auVar72,0x7f);
  fVar247 = fVar226 * auVar3._0_4_;
  fVar252 = fVar226 * auVar3._4_4_;
  fVar253 = fVar226 * auVar3._8_4_;
  fVar254 = fVar226 * auVar3._12_4_;
  auVar204._0_4_ = fVar128 * auVar72._0_4_;
  auVar204._4_4_ = fVar128 * auVar72._4_4_;
  auVar204._8_4_ = fVar128 * auVar72._8_4_;
  auVar204._12_4_ = fVar128 * auVar72._12_4_;
  fVar128 = auVar71._0_4_;
  auVar83._0_4_ = fVar128 * auVar3._0_4_;
  auVar83._4_4_ = fVar128 * auVar3._4_4_;
  auVar83._8_4_ = fVar128 * auVar3._8_4_;
  auVar83._12_4_ = fVar128 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar204,auVar83);
  auVar71 = vrcp14ss_avx512f(auVar131,auVar214);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar71,ZEXT416(0x40000000));
  fVar128 = auVar71._0_4_ * auVar62._0_4_;
  auVar62 = vdpps_avx(auVar68,auVar68,0x7f);
  fVar129 = auVar62._0_4_;
  auVar205._4_12_ = ZEXT812(0) << 0x20;
  auVar205._0_4_ = fVar129;
  auVar71 = vrsqrt14ss_avx512f(auVar131,auVar205);
  auVar72 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
  auVar65 = vmulss_avx512f(auVar62,ZEXT416(0x3f000000));
  fVar149 = auVar71._0_4_;
  fVar149 = auVar72._0_4_ - auVar65._0_4_ * fVar149 * fVar149 * fVar149;
  auVar71 = vdpps_avx(auVar68,auVar74,0x7f);
  fVar234 = fVar149 * auVar68._0_4_;
  fVar244 = fVar149 * auVar68._4_4_;
  fVar245 = fVar149 * auVar68._8_4_;
  fVar246 = fVar149 * auVar68._12_4_;
  auVar87._0_4_ = fVar129 * auVar74._0_4_;
  auVar87._4_4_ = fVar129 * auVar74._4_4_;
  auVar87._8_4_ = fVar129 * auVar74._8_4_;
  auVar87._12_4_ = fVar129 * auVar74._12_4_;
  fVar129 = auVar71._0_4_;
  auVar86._0_4_ = fVar129 * auVar68._0_4_;
  auVar86._4_4_ = fVar129 * auVar68._4_4_;
  auVar86._8_4_ = fVar129 * auVar68._8_4_;
  auVar86._12_4_ = fVar129 * auVar68._12_4_;
  auVar72 = vsubps_avx(auVar87,auVar86);
  auVar71 = vrcp14ss_avx512f(auVar131,auVar205);
  auVar62 = vfnmadd213ss_avx512f(auVar62,auVar71,ZEXT416(0x40000000));
  fVar129 = auVar62._0_4_ * auVar71._0_4_;
  auVar62 = vshufps_avx(auVar75,auVar75,0xff);
  auVar88._0_4_ = fVar247 * auVar62._0_4_;
  auVar88._4_4_ = fVar252 * auVar62._4_4_;
  auVar88._8_4_ = fVar253 * auVar62._8_4_;
  auVar88._12_4_ = fVar254 * auVar62._12_4_;
  local_4f0 = vsubps_avx(auVar75,auVar88);
  auVar71 = vshufps_avx(auVar69,auVar69,0xff);
  auVar85._0_4_ = auVar71._0_4_ * fVar247 + auVar62._0_4_ * fVar226 * fVar128 * auVar3._0_4_;
  auVar85._4_4_ = auVar71._4_4_ * fVar252 + auVar62._4_4_ * fVar226 * fVar128 * auVar3._4_4_;
  auVar85._8_4_ = auVar71._8_4_ * fVar253 + auVar62._8_4_ * fVar226 * fVar128 * auVar3._8_4_;
  auVar85._12_4_ = auVar71._12_4_ * fVar254 + auVar62._12_4_ * fVar226 * fVar128 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar69,auVar85);
  local_500._0_4_ = auVar88._0_4_ + auVar75._0_4_;
  local_500._4_4_ = auVar88._4_4_ + auVar75._4_4_;
  fStack_4f8 = auVar88._8_4_ + auVar75._8_4_;
  fStack_4f4 = auVar88._12_4_ + auVar75._12_4_;
  auVar65._0_4_ = fVar227 + auVar85._0_4_;
  auVar65._4_4_ = fVar140 + auVar85._4_4_;
  auVar65._8_4_ = fVar141 + auVar85._8_4_;
  auVar65._12_4_ = fVar142 + auVar85._12_4_;
  auVar62 = vshufps_avx(auVar76,auVar76,0xff);
  auVar80._0_4_ = fVar234 * auVar62._0_4_;
  auVar80._4_4_ = fVar244 * auVar62._4_4_;
  auVar80._8_4_ = fVar245 * auVar62._8_4_;
  auVar80._12_4_ = fVar246 * auVar62._12_4_;
  local_510 = vsubps_avx(auVar76,auVar80);
  auVar71 = vshufps_avx(auVar64,auVar64,0xff);
  auVar66._0_4_ = auVar71._0_4_ * fVar234 + auVar62._0_4_ * fVar149 * auVar72._0_4_ * fVar129;
  auVar66._4_4_ = auVar71._4_4_ * fVar244 + auVar62._4_4_ * fVar149 * auVar72._4_4_ * fVar129;
  auVar66._8_4_ = auVar71._8_4_ * fVar245 + auVar62._8_4_ * fVar149 * auVar72._8_4_ * fVar129;
  auVar66._12_4_ = auVar71._12_4_ * fVar246 + auVar62._12_4_ * fVar149 * auVar72._12_4_ * fVar129;
  auVar62 = vsubps_avx(auVar64,auVar66);
  _local_520 = vaddps_avx512vl(auVar76,auVar80);
  auVar67._0_4_ = fVar125 + auVar66._0_4_;
  auVar67._4_4_ = fVar211 + auVar66._4_4_;
  auVar67._8_4_ = fVar224 + auVar66._8_4_;
  auVar67._12_4_ = fVar225 + auVar66._12_4_;
  auVar71 = vmulps_avx512vl(auVar3,auVar63);
  local_530 = vaddps_avx512vl(local_4f0,auVar71);
  auVar62 = vmulps_avx512vl(auVar62,auVar63);
  local_540 = vsubps_avx512vl(local_510,auVar62);
  auVar62 = vmulps_avx512vl(auVar65,auVar63);
  _local_550 = vaddps_avx512vl(_local_500,auVar62);
  auVar62 = vmulps_avx512vl(auVar67,auVar63);
  _local_560 = vsubps_avx512vl(_local_520,auVar62);
  local_470 = vsubps_avx(local_4f0,auVar73);
  uVar130 = local_470._0_4_;
  auVar79._4_4_ = uVar130;
  auVar79._0_4_ = uVar130;
  auVar79._8_4_ = uVar130;
  auVar79._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_470,local_470,0x55);
  auVar71 = vshufps_avx(local_470,local_470,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar125 = pre->ray_space[k].vz.field_0.m128[0];
  fVar211 = pre->ray_space[k].vz.field_0.m128[1];
  fVar224 = pre->ray_space[k].vz.field_0.m128[2];
  fVar225 = pre->ray_space[k].vz.field_0.m128[3];
  auVar63._0_4_ = fVar125 * auVar71._0_4_;
  auVar63._4_4_ = fVar211 * auVar71._4_4_;
  auVar63._8_4_ = fVar224 * auVar71._8_4_;
  auVar63._12_4_ = fVar225 * auVar71._12_4_;
  auVar62 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar62);
  auVar74 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar79);
  local_480 = vsubps_avx512vl(local_530,auVar73);
  uVar130 = local_480._0_4_;
  auVar89._4_4_ = uVar130;
  auVar89._0_4_ = uVar130;
  auVar89._8_4_ = uVar130;
  auVar89._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_480,local_480,0x55);
  auVar71 = vshufps_avx(local_480,local_480,0xaa);
  auVar77._0_4_ = fVar125 * auVar71._0_4_;
  auVar77._4_4_ = fVar211 * auVar71._4_4_;
  auVar77._8_4_ = fVar224 * auVar71._8_4_;
  auVar77._12_4_ = fVar225 * auVar71._12_4_;
  auVar62 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar2,auVar62);
  auVar76 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar89);
  local_490 = vsubps_avx512vl(local_540,auVar73);
  uVar130 = local_490._0_4_;
  auVar81._4_4_ = uVar130;
  auVar81._0_4_ = uVar130;
  auVar81._8_4_ = uVar130;
  auVar81._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_490,local_490,0x55);
  auVar71 = vshufps_avx(local_490,local_490,0xaa);
  auVar78._0_4_ = fVar125 * auVar71._0_4_;
  auVar78._4_4_ = fVar211 * auVar71._4_4_;
  auVar78._8_4_ = fVar224 * auVar71._8_4_;
  auVar78._12_4_ = fVar225 * auVar71._12_4_;
  auVar62 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar62);
  auVar64 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar81);
  local_4a0 = vsubps_avx(local_510,auVar73);
  uVar130 = local_4a0._0_4_;
  auVar189._4_4_ = uVar130;
  auVar189._0_4_ = uVar130;
  auVar189._8_4_ = uVar130;
  auVar189._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar71 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar82._0_4_ = fVar125 * auVar71._0_4_;
  auVar82._4_4_ = fVar211 * auVar71._4_4_;
  auVar82._8_4_ = fVar224 * auVar71._8_4_;
  auVar82._12_4_ = fVar225 * auVar71._12_4_;
  auVar62 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar2,auVar62);
  auVar63 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar189);
  local_4b0 = vsubps_avx(_local_500,auVar73);
  uVar130 = local_4b0._0_4_;
  auVar190._4_4_ = uVar130;
  auVar190._0_4_ = uVar130;
  auVar190._8_4_ = uVar130;
  auVar190._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar71 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar215._0_4_ = auVar71._0_4_ * fVar125;
  auVar215._4_4_ = auVar71._4_4_ * fVar211;
  auVar215._8_4_ = auVar71._8_4_ * fVar224;
  auVar215._12_4_ = auVar71._12_4_ * fVar225;
  auVar62 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar62);
  auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar190);
  local_4c0 = vsubps_avx512vl(_local_550,auVar73);
  uVar130 = local_4c0._0_4_;
  auVar191._4_4_ = uVar130;
  auVar191._0_4_ = uVar130;
  auVar191._8_4_ = uVar130;
  auVar191._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar71 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar228._0_4_ = auVar71._0_4_ * fVar125;
  auVar228._4_4_ = auVar71._4_4_ * fVar211;
  auVar228._8_4_ = auVar71._8_4_ * fVar224;
  auVar228._12_4_ = auVar71._12_4_ * fVar225;
  auVar62 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar2,auVar62);
  auVar66 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar191);
  local_4d0 = vsubps_avx512vl(_local_560,auVar73);
  uVar130 = local_4d0._0_4_;
  auVar192._4_4_ = uVar130;
  auVar192._0_4_ = uVar130;
  auVar192._8_4_ = uVar130;
  auVar192._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar71 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar236._0_4_ = auVar71._0_4_ * fVar125;
  auVar236._4_4_ = auVar71._4_4_ * fVar211;
  auVar236._8_4_ = auVar71._8_4_ * fVar224;
  auVar236._12_4_ = auVar71._12_4_ * fVar225;
  auVar62 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar2,auVar62);
  auVar67 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar192);
  local_4e0 = vsubps_avx512vl(_local_520,auVar73);
  uVar130 = local_4e0._0_4_;
  auVar69._4_4_ = uVar130;
  auVar69._0_4_ = uVar130;
  auVar69._8_4_ = uVar130;
  auVar69._12_4_ = uVar130;
  auVar62 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar71 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar84._0_4_ = auVar71._0_4_ * fVar125;
  auVar84._4_4_ = auVar71._4_4_ * fVar211;
  auVar84._8_4_ = auVar71._8_4_ * fVar224;
  auVar84._12_4_ = auVar71._12_4_ * fVar225;
  auVar62 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar2,auVar62);
  auVar69 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar69);
  auVar3 = vmovlhps_avx(auVar74,auVar65);
  auVar72 = vmovlhps_avx(auVar76,auVar66);
  auVar68 = vmovlhps_avx512f(auVar64,auVar67);
  _local_5e0 = vmovlhps_avx512f(auVar63,auVar69);
  auVar71 = vminps_avx(auVar3,auVar72);
  auVar62 = vmaxps_avx(auVar3,auVar72);
  auVar73 = vminps_avx512vl(auVar68,_local_5e0);
  auVar71 = vminps_avx(auVar71,auVar73);
  auVar73 = vmaxps_avx512vl(auVar68,_local_5e0);
  auVar62 = vmaxps_avx(auVar62,auVar73);
  auVar73 = vshufpd_avx(auVar71,auVar71,3);
  auVar71 = vminps_avx(auVar71,auVar73);
  auVar73 = vshufpd_avx(auVar62,auVar62,3);
  auVar62 = vmaxps_avx(auVar62,auVar73);
  auVar71 = vandps_avx512vl(auVar71,auVar264._0_16_);
  auVar62 = vandps_avx512vl(auVar62,auVar264._0_16_);
  auVar62 = vmaxps_avx(auVar71,auVar62);
  auVar71 = vmovshdup_avx(auVar62);
  auVar62 = vmaxss_avx(auVar71,auVar62);
  local_5c0 = vmovddup_avx512vl(auVar74);
  local_5d0 = vmovddup_avx512vl(auVar76);
  auVar131._8_8_ = auVar64._0_8_;
  auVar131._0_8_ = auVar64._0_8_;
  auVar173._0_8_ = auVar63._0_8_;
  auVar173._8_8_ = auVar173._0_8_;
  local_5f0 = ZEXT416((uint)(auVar62._0_4_ * 9.536743e-07));
  local_3c0 = vbroadcastss_avx512vl(local_5f0);
  auVar62 = vxorps_avx512vl(local_3c0._0_16_,auVar265._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar62);
  uVar54 = 0;
  auVar62 = vsubps_avx(auVar72,auVar3);
  auVar73 = vsubps_avx512vl(auVar68,auVar72);
  auVar74 = vsubps_avx512vl(_local_5e0,auVar68);
  local_570 = vsubps_avx(_local_500,local_4f0);
  local_580 = vsubps_avx512vl(_local_550,local_530);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  _local_5a0 = vsubps_avx512vl(_local_520,local_510);
  auVar127 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar127);
  auVar127 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar127);
  auVar71 = ZEXT816(0x3f80000000000000);
  auVar262 = ZEXT1664(auVar71);
  auVar123._32_32_ = auVar127._32_32_;
  do {
    auVar89 = auVar262._0_16_;
    auVar76 = vshufps_avx(auVar89,auVar89,0x50);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar64 = vsubps_avx512vl(auVar96._0_16_,auVar76);
    fVar125 = auVar76._0_4_;
    fVar128 = auVar65._0_4_;
    auVar151._0_4_ = fVar128 * fVar125;
    fVar211 = auVar76._4_4_;
    fVar129 = auVar65._4_4_;
    auVar151._4_4_ = fVar129 * fVar211;
    fVar224 = auVar76._8_4_;
    auVar151._8_4_ = fVar128 * fVar224;
    fVar225 = auVar76._12_4_;
    auVar151._12_4_ = fVar129 * fVar225;
    fVar140 = auVar66._0_4_;
    auVar161._0_4_ = fVar140 * fVar125;
    fVar141 = auVar66._4_4_;
    auVar161._4_4_ = fVar141 * fVar211;
    auVar161._8_4_ = fVar140 * fVar224;
    auVar161._12_4_ = fVar141 * fVar225;
    fVar142 = auVar67._0_4_;
    auVar167._0_4_ = fVar142 * fVar125;
    fVar234 = auVar67._4_4_;
    auVar167._4_4_ = fVar234 * fVar211;
    auVar167._8_4_ = fVar142 * fVar224;
    auVar167._12_4_ = fVar234 * fVar225;
    fVar244 = auVar69._0_4_;
    auVar132._0_4_ = fVar244 * fVar125;
    fVar245 = auVar69._4_4_;
    auVar132._4_4_ = fVar245 * fVar211;
    auVar132._8_4_ = fVar244 * fVar224;
    auVar132._12_4_ = fVar245 * fVar225;
    auVar63 = vfmadd231ps_avx512vl(auVar151,auVar64,local_5c0);
    auVar70 = vfmadd231ps_avx512vl(auVar161,auVar64,local_5d0);
    auVar75 = vfmadd231ps_avx512vl(auVar167,auVar64,auVar131);
    auVar64 = vfmadd231ps_fma(auVar132,auVar173,auVar64);
    auVar76 = vmovshdup_avx(auVar71);
    fVar211 = auVar71._0_4_;
    fVar125 = (auVar76._0_4_ - fVar211) * 0.04761905;
    auVar188._4_4_ = fVar211;
    auVar188._0_4_ = fVar211;
    auVar188._8_4_ = fVar211;
    auVar188._12_4_ = fVar211;
    auVar188._16_4_ = fVar211;
    auVar188._20_4_ = fVar211;
    auVar188._24_4_ = fVar211;
    auVar188._28_4_ = fVar211;
    auVar146._0_8_ = auVar76._0_8_;
    auVar146._8_8_ = auVar146._0_8_;
    auVar146._16_8_ = auVar146._0_8_;
    auVar146._24_8_ = auVar146._0_8_;
    auVar95 = vsubps_avx(auVar146,auVar188);
    uVar130 = auVar63._0_4_;
    auVar147._4_4_ = uVar130;
    auVar147._0_4_ = uVar130;
    auVar147._8_4_ = uVar130;
    auVar147._12_4_ = uVar130;
    auVar147._16_4_ = uVar130;
    auVar147._20_4_ = uVar130;
    auVar147._24_4_ = uVar130;
    auVar147._28_4_ = uVar130;
    auVar208._8_4_ = 1;
    auVar208._0_8_ = 0x100000001;
    auVar208._12_4_ = 1;
    auVar208._16_4_ = 1;
    auVar208._20_4_ = 1;
    auVar208._24_4_ = 1;
    auVar208._28_4_ = 1;
    auVar106 = ZEXT1632(auVar63);
    auVar93 = vpermps_avx2(auVar208,auVar106);
    auVar94 = vbroadcastss_avx512vl(auVar70);
    auVar107 = ZEXT1632(auVar70);
    auVar97 = vpermps_avx512vl(auVar208,auVar107);
    auVar98 = vbroadcastss_avx512vl(auVar75);
    auVar103 = ZEXT1632(auVar75);
    auVar99 = vpermps_avx512vl(auVar208,auVar103);
    auVar100 = vbroadcastss_avx512vl(auVar64);
    auVar104 = ZEXT1632(auVar64);
    auVar92 = vpermps_avx512vl(auVar208,auVar104);
    auVar209._4_4_ = fVar125;
    auVar209._0_4_ = fVar125;
    auVar209._8_4_ = fVar125;
    auVar209._12_4_ = fVar125;
    auVar209._16_4_ = fVar125;
    auVar209._20_4_ = fVar125;
    auVar209._24_4_ = fVar125;
    auVar209._28_4_ = fVar125;
    auVar105 = auVar268._0_32_;
    auVar101 = vpermps_avx512vl(auVar105,auVar106);
    auVar177._8_4_ = 3;
    auVar177._0_8_ = 0x300000003;
    auVar177._12_4_ = 3;
    auVar177._16_4_ = 3;
    auVar177._20_4_ = 3;
    auVar177._24_4_ = 3;
    auVar177._28_4_ = 3;
    auVar102 = vpermps_avx512vl(auVar177,auVar106);
    auVar90 = vpermps_avx512vl(auVar105,auVar107);
    auVar106 = vpermps_avx2(auVar177,auVar107);
    auVar91 = vpermps_avx512vl(auVar105,auVar103);
    auVar107 = vpermps_avx2(auVar177,auVar103);
    auVar103 = vpermps_avx512vl(auVar105,auVar104);
    auVar104 = vpermps_avx512vl(auVar177,auVar104);
    auVar76 = vfmadd132ps_fma(auVar95,auVar188,_DAT_02020f20);
    auVar96 = vsubps_avx512vl(auVar96,ZEXT1632(auVar76));
    auVar95 = vmulps_avx512vl(auVar94,ZEXT1632(auVar76));
    auVar108 = ZEXT1632(auVar76);
    auVar105 = vmulps_avx512vl(auVar97,auVar108);
    auVar64 = vfmadd231ps_fma(auVar95,auVar96,auVar147);
    auVar63 = vfmadd231ps_fma(auVar105,auVar96,auVar93);
    auVar95 = vmulps_avx512vl(auVar98,auVar108);
    auVar105 = vmulps_avx512vl(auVar99,auVar108);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,auVar94);
    auVar94 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar97);
    auVar97 = vmulps_avx512vl(auVar100,auVar108);
    auVar105 = ZEXT1632(auVar76);
    auVar92 = vmulps_avx512vl(auVar92,auVar105);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar98);
    auVar98 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar99);
    fVar224 = auVar76._0_4_;
    fVar225 = auVar76._4_4_;
    auVar31._4_4_ = fVar225 * auVar95._4_4_;
    auVar31._0_4_ = fVar224 * auVar95._0_4_;
    fVar226 = auVar76._8_4_;
    auVar31._8_4_ = fVar226 * auVar95._8_4_;
    fVar149 = auVar76._12_4_;
    auVar31._12_4_ = fVar149 * auVar95._12_4_;
    auVar31._16_4_ = auVar95._16_4_ * 0.0;
    auVar31._20_4_ = auVar95._20_4_ * 0.0;
    auVar31._24_4_ = auVar95._24_4_ * 0.0;
    auVar31._28_4_ = fVar211;
    auVar32._4_4_ = fVar225 * auVar94._4_4_;
    auVar32._0_4_ = fVar224 * auVar94._0_4_;
    auVar32._8_4_ = fVar226 * auVar94._8_4_;
    auVar32._12_4_ = fVar149 * auVar94._12_4_;
    auVar32._16_4_ = auVar94._16_4_ * 0.0;
    auVar32._20_4_ = auVar94._20_4_ * 0.0;
    auVar32._24_4_ = auVar94._24_4_ * 0.0;
    auVar32._28_4_ = auVar93._28_4_;
    auVar64 = vfmadd231ps_fma(auVar31,auVar96,ZEXT1632(auVar64));
    auVar63 = vfmadd231ps_fma(auVar32,auVar96,ZEXT1632(auVar63));
    auVar138._0_4_ = fVar224 * auVar97._0_4_;
    auVar138._4_4_ = fVar225 * auVar97._4_4_;
    auVar138._8_4_ = fVar226 * auVar97._8_4_;
    auVar138._12_4_ = fVar149 * auVar97._12_4_;
    auVar138._16_4_ = auVar97._16_4_ * 0.0;
    auVar138._20_4_ = auVar97._20_4_ * 0.0;
    auVar138._24_4_ = auVar97._24_4_ * 0.0;
    auVar138._28_4_ = 0;
    auVar33._4_4_ = fVar225 * auVar98._4_4_;
    auVar33._0_4_ = fVar224 * auVar98._0_4_;
    auVar33._8_4_ = fVar226 * auVar98._8_4_;
    auVar33._12_4_ = fVar149 * auVar98._12_4_;
    auVar33._16_4_ = auVar98._16_4_ * 0.0;
    auVar33._20_4_ = auVar98._20_4_ * 0.0;
    auVar33._24_4_ = auVar98._24_4_ * 0.0;
    auVar33._28_4_ = auVar97._28_4_;
    auVar70 = vfmadd231ps_fma(auVar138,auVar96,auVar95);
    auVar75 = vfmadd231ps_fma(auVar33,auVar96,auVar94);
    auVar34._28_4_ = auVar94._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar149 * auVar75._12_4_,
                            CONCAT48(fVar226 * auVar75._8_4_,
                                     CONCAT44(fVar225 * auVar75._4_4_,fVar224 * auVar75._0_4_))));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar70._12_4_,
                                                 CONCAT48(fVar226 * auVar70._8_4_,
                                                          CONCAT44(fVar225 * auVar70._4_4_,
                                                                   fVar224 * auVar70._0_4_)))),
                              auVar96,ZEXT1632(auVar64));
    auVar77 = vfmadd231ps_fma(auVar34,auVar96,ZEXT1632(auVar63));
    auVar95 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar64));
    auVar93 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar63));
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar95 = vmulps_avx512vl(auVar95,auVar94);
    auVar93 = vmulps_avx512vl(auVar93,auVar94);
    auVar202._0_4_ = fVar125 * auVar95._0_4_;
    auVar202._4_4_ = fVar125 * auVar95._4_4_;
    auVar202._8_4_ = fVar125 * auVar95._8_4_;
    auVar202._12_4_ = fVar125 * auVar95._12_4_;
    auVar202._16_4_ = fVar125 * auVar95._16_4_;
    auVar202._20_4_ = fVar125 * auVar95._20_4_;
    auVar202._24_4_ = fVar125 * auVar95._24_4_;
    auVar202._28_4_ = 0;
    auVar95 = vmulps_avx512vl(auVar209,auVar93);
    auVar70 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_0205fd20,ZEXT1632(auVar70));
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar77),_DAT_0205fd20,ZEXT1632(auVar70));
    auVar139._0_4_ = auVar202._0_4_ + auVar79._0_4_;
    auVar139._4_4_ = auVar202._4_4_ + auVar79._4_4_;
    auVar139._8_4_ = auVar202._8_4_ + auVar79._8_4_;
    auVar139._12_4_ = auVar202._12_4_ + auVar79._12_4_;
    auVar139._16_4_ = auVar202._16_4_ + 0.0;
    auVar139._20_4_ = auVar202._20_4_ + 0.0;
    auVar139._24_4_ = auVar202._24_4_ + 0.0;
    auVar139._28_4_ = 0;
    auVar108 = ZEXT1632(auVar70);
    auVar93 = vpermt2ps_avx512vl(auVar202,_DAT_0205fd20,auVar108);
    auVar99 = vaddps_avx512vl(ZEXT1632(auVar77),auVar95);
    auVar100 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,auVar108);
    auVar95 = vsubps_avx(auVar97,auVar93);
    auVar100 = vsubps_avx512vl(auVar98,auVar100);
    auVar93 = vmulps_avx512vl(auVar90,auVar105);
    auVar92 = vmulps_avx512vl(auVar106,auVar105);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar101);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar102);
    auVar101 = vmulps_avx512vl(auVar91,auVar105);
    auVar102 = vmulps_avx512vl(auVar107,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar90);
    auVar106 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar106);
    auVar102 = vmulps_avx512vl(auVar103,auVar105);
    auVar90 = vmulps_avx512vl(auVar104,auVar105);
    auVar64 = vfmadd231ps_fma(auVar102,auVar96,auVar91);
    auVar63 = vfmadd231ps_fma(auVar90,auVar96,auVar107);
    auVar102 = vmulps_avx512vl(auVar105,auVar101);
    auVar90 = vmulps_avx512vl(ZEXT1632(auVar76),auVar106);
    auVar93 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar93);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar92);
    auVar101 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar149 * auVar64._12_4_,
                                             CONCAT48(fVar226 * auVar64._8_4_,
                                                      CONCAT44(fVar225 * auVar64._4_4_,
                                                               fVar224 * auVar64._0_4_)))),auVar96,
                          auVar101);
    auVar106 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar149 * auVar63._12_4_,
                                             CONCAT48(fVar226 * auVar63._8_4_,
                                                      CONCAT44(fVar225 * auVar63._4_4_,
                                                               fVar224 * auVar63._0_4_)))),auVar96,
                          auVar106);
    auVar35._4_4_ = fVar225 * auVar101._4_4_;
    auVar35._0_4_ = fVar224 * auVar101._0_4_;
    auVar35._8_4_ = fVar226 * auVar101._8_4_;
    auVar35._12_4_ = fVar149 * auVar101._12_4_;
    auVar35._16_4_ = auVar101._16_4_ * 0.0;
    auVar35._20_4_ = auVar101._20_4_ * 0.0;
    auVar35._24_4_ = auVar101._24_4_ * 0.0;
    auVar35._28_4_ = auVar107._28_4_;
    auVar36._4_4_ = fVar225 * auVar106._4_4_;
    auVar36._0_4_ = fVar224 * auVar106._0_4_;
    auVar36._8_4_ = fVar226 * auVar106._8_4_;
    auVar36._12_4_ = fVar149 * auVar106._12_4_;
    auVar36._16_4_ = auVar106._16_4_ * 0.0;
    auVar36._20_4_ = auVar106._20_4_ * 0.0;
    auVar36._24_4_ = auVar106._24_4_ * 0.0;
    auVar36._28_4_ = auVar91._28_4_;
    auVar107 = vfmadd231ps_avx512vl(auVar35,auVar96,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar36,auVar92,auVar96);
    auVar93 = vsubps_avx512vl(auVar101,auVar93);
    auVar106 = vsubps_avx512vl(auVar106,auVar92);
    auVar93 = vmulps_avx512vl(auVar93,auVar94);
    auVar106 = vmulps_avx512vl(auVar106,auVar94);
    fVar211 = fVar125 * auVar93._0_4_;
    fVar224 = fVar125 * auVar93._4_4_;
    auVar37._4_4_ = fVar224;
    auVar37._0_4_ = fVar211;
    fVar225 = fVar125 * auVar93._8_4_;
    auVar37._8_4_ = fVar225;
    fVar226 = fVar125 * auVar93._12_4_;
    auVar37._12_4_ = fVar226;
    fVar149 = fVar125 * auVar93._16_4_;
    auVar37._16_4_ = fVar149;
    fVar227 = fVar125 * auVar93._20_4_;
    auVar37._20_4_ = fVar227;
    fVar125 = fVar125 * auVar93._24_4_;
    auVar37._24_4_ = fVar125;
    auVar37._28_4_ = auVar93._28_4_;
    auVar106 = vmulps_avx512vl(auVar209,auVar106);
    auVar94 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,auVar108);
    auVar92 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar108);
    auVar210._0_4_ = auVar107._0_4_ + fVar211;
    auVar210._4_4_ = auVar107._4_4_ + fVar224;
    auVar210._8_4_ = auVar107._8_4_ + fVar225;
    auVar210._12_4_ = auVar107._12_4_ + fVar226;
    auVar210._16_4_ = auVar107._16_4_ + fVar149;
    auVar210._20_4_ = auVar107._20_4_ + fVar227;
    auVar210._24_4_ = auVar107._24_4_ + fVar125;
    auVar210._28_4_ = auVar107._28_4_ + auVar93._28_4_;
    auVar93 = vpermt2ps_avx512vl(auVar37,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar101 = vaddps_avx512vl(auVar96,auVar106);
    auVar106 = vpermt2ps_avx512vl(auVar106,_DAT_0205fd20,ZEXT1632(auVar70));
    auVar93 = vsubps_avx(auVar94,auVar93);
    auVar106 = vsubps_avx512vl(auVar92,auVar106);
    auVar158 = ZEXT1632(auVar79);
    auVar102 = vsubps_avx512vl(auVar107,auVar158);
    auVar165 = ZEXT1632(auVar77);
    auVar90 = vsubps_avx512vl(auVar96,auVar165);
    auVar91 = vsubps_avx512vl(auVar94,auVar97);
    auVar102 = vaddps_avx512vl(auVar102,auVar91);
    auVar91 = vsubps_avx512vl(auVar92,auVar98);
    auVar90 = vaddps_avx512vl(auVar90,auVar91);
    auVar91 = vmulps_avx512vl(auVar165,auVar102);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar158,auVar90);
    auVar103 = vmulps_avx512vl(auVar99,auVar102);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar139,auVar90);
    auVar104 = vmulps_avx512vl(auVar100,auVar102);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar95,auVar90);
    auVar105 = vmulps_avx512vl(auVar98,auVar102);
    auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar97,auVar90);
    auVar108 = vmulps_avx512vl(auVar96,auVar102);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar107,auVar90);
    auVar109 = vmulps_avx512vl(auVar101,auVar102);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar210,auVar90);
    auVar110 = vmulps_avx512vl(auVar106,auVar102);
    auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar93,auVar90);
    auVar102 = vmulps_avx512vl(auVar92,auVar102);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar94,auVar90);
    auVar90 = vminps_avx512vl(auVar91,auVar103);
    auVar91 = vmaxps_avx512vl(auVar91,auVar103);
    auVar103 = vminps_avx512vl(auVar104,auVar105);
    auVar90 = vminps_avx512vl(auVar90,auVar103);
    auVar103 = vmaxps_avx512vl(auVar104,auVar105);
    auVar91 = vmaxps_avx512vl(auVar91,auVar103);
    auVar103 = vminps_avx512vl(auVar108,auVar109);
    auVar104 = vmaxps_avx512vl(auVar108,auVar109);
    auVar105 = vminps_avx512vl(auVar110,auVar102);
    auVar103 = vminps_avx512vl(auVar103,auVar105);
    auVar90 = vminps_avx512vl(auVar90,auVar103);
    auVar102 = vmaxps_avx512vl(auVar110,auVar102);
    auVar102 = vmaxps_avx512vl(auVar104,auVar102);
    auVar102 = vmaxps_avx512vl(auVar91,auVar102);
    uVar27 = vcmpps_avx512vl(auVar90,local_3c0,2);
    uVar28 = vcmpps_avx512vl(auVar102,local_3e0,5);
    uVar56 = 0;
    bVar52 = (byte)uVar27 & (byte)uVar28 & 0x7f;
    if (bVar52 != 0) {
      auVar102 = vsubps_avx512vl(auVar97,auVar158);
      auVar90 = vsubps_avx512vl(auVar98,auVar165);
      auVar91 = vsubps_avx512vl(auVar94,auVar107);
      auVar102 = vaddps_avx512vl(auVar102,auVar91);
      auVar91 = vsubps_avx512vl(auVar92,auVar96);
      auVar90 = vaddps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(auVar165,auVar102);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar90,auVar158);
      auVar99 = vmulps_avx512vl(auVar99,auVar102);
      auVar99 = vfnmadd213ps_avx512vl(auVar139,auVar90,auVar99);
      auVar100 = vmulps_avx512vl(auVar100,auVar102);
      auVar100 = vfnmadd213ps_avx512vl(auVar95,auVar90,auVar100);
      auVar95 = vmulps_avx512vl(auVar98,auVar102);
      auVar97 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar97);
      auVar95 = vmulps_avx512vl(auVar96,auVar102);
      auVar96 = vfnmadd231ps_avx512vl(auVar95,auVar90,auVar107);
      auVar95 = vmulps_avx512vl(auVar101,auVar102);
      auVar98 = vfnmadd213ps_avx512vl(auVar210,auVar90,auVar95);
      auVar95 = vmulps_avx512vl(auVar106,auVar102);
      auVar101 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar95);
      auVar95 = vmulps_avx512vl(auVar92,auVar102);
      auVar94 = vfnmadd231ps_avx512vl(auVar95,auVar94,auVar90);
      auVar93 = vminps_avx(auVar91,auVar99);
      auVar95 = vmaxps_avx(auVar91,auVar99);
      auVar106 = vminps_avx(auVar100,auVar97);
      auVar106 = vminps_avx(auVar93,auVar106);
      auVar93 = vmaxps_avx(auVar100,auVar97);
      auVar95 = vmaxps_avx(auVar95,auVar93);
      auVar107 = vminps_avx(auVar96,auVar98);
      auVar93 = vmaxps_avx(auVar96,auVar98);
      auVar96 = vminps_avx(auVar101,auVar94);
      auVar107 = vminps_avx(auVar107,auVar96);
      auVar107 = vminps_avx(auVar106,auVar107);
      auVar106 = vmaxps_avx(auVar101,auVar94);
      auVar93 = vmaxps_avx(auVar93,auVar106);
      auVar95 = vmaxps_avx(auVar95,auVar93);
      uVar27 = vcmpps_avx512vl(auVar95,local_3e0,5);
      uVar28 = vcmpps_avx512vl(auVar107,local_3c0,2);
      uVar56 = (uint)(bVar52 & (byte)uVar27 & (byte)uVar28);
    }
    if (uVar56 != 0) {
      auStack_5b0[uVar54] = uVar56;
      uVar27 = vmovlps_avx(auVar71);
      *(undefined8 *)(&uStack_460 + uVar54 * 2) = uVar27;
      uVar58 = vmovlps_avx512f(auVar89);
      auStack_3a0[uVar54] = uVar58;
      uVar54 = (ulong)((int)uVar54 + 1);
    }
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar127 = ZEXT1664(auVar71);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar264 = ZEXT1664(auVar71);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar265 = ZEXT1664(auVar71);
    auVar262._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar262._32_32_ = auVar123._32_32_;
    auVar263 = ZEXT3264(auVar262._0_32_);
    auVar266 = ZEXT464(0x3f800000);
    auVar112._16_48_ = auVar262._16_48_;
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar267 = ZEXT1664(auVar71);
    do {
      auVar123._32_32_ = auVar112._32_32_;
      auVar71 = auVar267._0_16_;
      if ((int)uVar54 == 0) {
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar30._4_4_ = uVar130;
        auVar30._0_4_ = uVar130;
        auVar30._8_4_ = uVar130;
        auVar30._12_4_ = uVar130;
        auVar30._16_4_ = uVar130;
        auVar30._20_4_ = uVar130;
        auVar30._24_4_ = uVar130;
        auVar30._28_4_ = uVar130;
        uVar27 = vcmpps_avx512vl(local_400,auVar30,2);
        uVar61 = (uint)uVar60 & (uint)uVar60 + 0xff & (uint)uVar27;
        uVar60 = (ulong)uVar61;
        if (uVar61 == 0) {
          return;
        }
        goto LAB_01da0441;
      }
      uVar53 = (int)uVar54 - 1;
      uVar55 = (ulong)uVar53;
      uVar56 = (&uStack_460)[uVar55 * 2];
      fVar125 = afStack_45c[uVar55 * 2];
      uVar6 = auStack_5b0[uVar55];
      auVar260._8_8_ = 0;
      auVar260._0_8_ = auStack_3a0[uVar55];
      auVar262 = ZEXT1664(auVar260);
      lVar59 = 0;
      for (uVar58 = (ulong)uVar6; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        lVar59 = lVar59 + 1;
      }
      uVar57 = uVar6 - 1 & uVar6;
      auStack_5b0[uVar55] = uVar57;
      if (uVar57 == 0) {
        uVar54 = (ulong)uVar53;
      }
      auVar143._0_4_ = (float)lVar59;
      auVar143._4_8_ = SUB128(ZEXT812(0),4);
      auVar143._12_4_ = 0;
      auVar76 = vmulss_avx512f(auVar143,SUB6416(ZEXT464(0x3e124925),0));
      lVar59 = lVar59 + 1;
      auVar64 = vmulss_avx512f(ZEXT416((uint)(float)lVar59),SUB6416(ZEXT464(0x3e124925),0));
      auVar70 = auVar266._0_16_;
      auVar63 = vsubss_avx512f(auVar70,auVar76);
      auVar76 = vmulss_avx512f(ZEXT416((uint)fVar125),auVar76);
      auVar63 = vfmadd231ss_avx512f(auVar76,ZEXT416(uVar56),auVar63);
      auVar76 = vsubss_avx512f(auVar70,auVar64);
      auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * auVar64._0_4_)),ZEXT416(uVar56),auVar76);
      auVar64 = vsubss_avx512f(auVar76,auVar63);
      vucomiss_avx512f(auVar64);
      if (uVar6 == 0 || lVar59 == 0) break;
      auVar75 = vshufps_avx(auVar260,auVar260,0x50);
      vucomiss_avx512f(auVar64);
      auVar77 = vsubps_avx512vl(auVar71,auVar75);
      fVar125 = auVar75._0_4_;
      auVar152._0_4_ = fVar128 * fVar125;
      fVar211 = auVar75._4_4_;
      auVar152._4_4_ = fVar129 * fVar211;
      fVar224 = auVar75._8_4_;
      auVar152._8_4_ = fVar128 * fVar224;
      fVar225 = auVar75._12_4_;
      auVar152._12_4_ = fVar129 * fVar225;
      auVar162._0_4_ = fVar140 * fVar125;
      auVar162._4_4_ = fVar141 * fVar211;
      auVar162._8_4_ = fVar140 * fVar224;
      auVar162._12_4_ = fVar141 * fVar225;
      auVar168._0_4_ = fVar142 * fVar125;
      auVar168._4_4_ = fVar234 * fVar211;
      auVar168._8_4_ = fVar142 * fVar224;
      auVar168._12_4_ = fVar234 * fVar225;
      auVar133._0_4_ = fVar244 * fVar125;
      auVar133._4_4_ = fVar245 * fVar211;
      auVar133._8_4_ = fVar244 * fVar224;
      auVar133._12_4_ = fVar245 * fVar225;
      auVar75 = vfmadd231ps_fma(auVar152,auVar77,local_5c0);
      auVar79 = vfmadd231ps_fma(auVar162,auVar77,local_5d0);
      auVar78 = vfmadd231ps_avx512vl(auVar168,auVar77,auVar131);
      auVar77 = vfmadd231ps_fma(auVar133,auVar173,auVar77);
      auVar148._16_16_ = auVar75;
      auVar148._0_16_ = auVar75;
      auVar159._16_16_ = auVar79;
      auVar159._0_16_ = auVar79;
      auVar166._16_16_ = auVar78;
      auVar166._0_16_ = auVar78;
      uVar130 = auVar63._0_4_;
      auVar178._4_4_ = uVar130;
      auVar178._0_4_ = uVar130;
      auVar178._8_4_ = uVar130;
      auVar178._12_4_ = uVar130;
      uVar130 = auVar76._0_4_;
      auVar178._20_4_ = uVar130;
      auVar178._16_4_ = uVar130;
      auVar178._24_4_ = uVar130;
      auVar178._28_4_ = uVar130;
      auVar95 = vsubps_avx(auVar159,auVar148);
      auVar79 = vfmadd213ps_fma(auVar95,auVar178,auVar148);
      auVar95 = vsubps_avx(auVar166,auVar159);
      auVar89 = vfmadd213ps_fma(auVar95,auVar178,auVar159);
      auVar75 = vsubps_avx(auVar77,auVar78);
      auVar160._16_16_ = auVar75;
      auVar160._0_16_ = auVar75;
      auVar75 = vfmadd213ps_fma(auVar160,auVar178,auVar166);
      auVar95 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar79));
      auVar79 = vfmadd213ps_fma(auVar95,auVar178,ZEXT1632(auVar79));
      auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar89));
      auVar75 = vfmadd213ps_fma(auVar95,auVar178,ZEXT1632(auVar89));
      auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar79));
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar95,auVar178);
      auVar123._0_32_ = vmulps_avx512vl(auVar95,auVar263._0_32_);
      fVar125 = auVar64._0_4_ * 0.33333334;
      auVar169._0_8_ =
           CONCAT44(auVar84._4_4_ + fVar125 * auVar123._4_4_,
                    auVar84._0_4_ + fVar125 * auVar123._0_4_);
      auVar169._8_4_ = auVar84._8_4_ + fVar125 * auVar123._8_4_;
      auVar169._12_4_ = auVar84._12_4_ + fVar125 * auVar123._12_4_;
      auVar153._0_4_ = fVar125 * auVar123._16_4_;
      auVar153._4_4_ = fVar125 * auVar123._20_4_;
      auVar153._8_4_ = fVar125 * auVar123._24_4_;
      auVar153._12_4_ = fVar125 * auVar123._28_4_;
      auVar179 = vsubps_avx((undefined1  [16])0x0,auVar153);
      auVar87 = vshufpd_avx(auVar84,auVar84,3);
      auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar75 = vsubps_avx(auVar87,auVar84);
      auVar79 = vsubps_avx(auVar85,(undefined1  [16])0x0);
      auVar180._0_4_ = auVar79._0_4_ + auVar75._0_4_;
      auVar180._4_4_ = auVar79._4_4_ + auVar75._4_4_;
      auVar180._8_4_ = auVar79._8_4_ + auVar75._8_4_;
      auVar180._12_4_ = auVar79._12_4_ + auVar75._12_4_;
      auVar75 = vshufps_avx(auVar84,auVar84,0xb1);
      auVar79 = vshufps_avx(auVar169,auVar169,0xb1);
      auVar77 = vshufps_avx(auVar179,auVar179,0xb1);
      auVar89 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar237._4_4_ = auVar180._0_4_;
      auVar237._0_4_ = auVar180._0_4_;
      auVar237._8_4_ = auVar180._0_4_;
      auVar237._12_4_ = auVar180._0_4_;
      auVar78 = vshufps_avx(auVar180,auVar180,0x55);
      fVar125 = auVar78._0_4_;
      auVar193._0_4_ = auVar75._0_4_ * fVar125;
      fVar211 = auVar78._4_4_;
      auVar193._4_4_ = auVar75._4_4_ * fVar211;
      fVar224 = auVar78._8_4_;
      auVar193._8_4_ = auVar75._8_4_ * fVar224;
      fVar225 = auVar78._12_4_;
      auVar193._12_4_ = auVar75._12_4_ * fVar225;
      auVar206._0_4_ = auVar79._0_4_ * fVar125;
      auVar206._4_4_ = auVar79._4_4_ * fVar211;
      auVar206._8_4_ = auVar79._8_4_ * fVar224;
      auVar206._12_4_ = auVar79._12_4_ * fVar225;
      auVar216._0_4_ = auVar77._0_4_ * fVar125;
      auVar216._4_4_ = auVar77._4_4_ * fVar211;
      auVar216._8_4_ = auVar77._8_4_ * fVar224;
      auVar216._12_4_ = auVar77._12_4_ * fVar225;
      auVar181._0_4_ = auVar89._0_4_ * fVar125;
      auVar181._4_4_ = auVar89._4_4_ * fVar211;
      auVar181._8_4_ = auVar89._8_4_ * fVar224;
      auVar181._12_4_ = auVar89._12_4_ * fVar225;
      auVar75 = vfmadd231ps_fma(auVar193,auVar237,auVar84);
      auVar79 = vfmadd231ps_fma(auVar206,auVar237,auVar169);
      auVar78 = vfmadd231ps_fma(auVar216,auVar237,auVar179);
      auVar83 = vfmadd231ps_fma(auVar181,(undefined1  [16])0x0,auVar237);
      auVar86 = vshufpd_avx(auVar75,auVar75,1);
      auVar80 = vshufpd_avx(auVar79,auVar79,1);
      auVar81 = vshufpd_avx(auVar78,auVar78,1);
      auVar82 = vshufpd_avx(auVar83,auVar83,1);
      auVar77 = vminss_avx(auVar75,auVar79);
      auVar75 = vmaxss_avx(auVar79,auVar75);
      auVar89 = vminss_avx(auVar78,auVar83);
      auVar79 = vmaxss_avx(auVar83,auVar78);
      auVar89 = vminss_avx(auVar77,auVar89);
      auVar75 = vmaxss_avx(auVar79,auVar75);
      auVar78 = vminss_avx(auVar86,auVar80);
      auVar79 = vmaxss_avx(auVar80,auVar86);
      auVar86 = vminss_avx(auVar81,auVar82);
      auVar77 = vmaxss_avx(auVar82,auVar81);
      auVar78 = vminss_avx(auVar78,auVar86);
      auVar79 = vmaxss_avx(auVar77,auVar79);
      fVar224 = auVar89._0_4_;
      auVar112._16_48_ = auVar123._16_48_;
      fVar211 = auVar79._0_4_;
      fVar125 = auVar75._0_4_;
      if ((0.0001 <= fVar224) || (fVar211 <= -0.0001)) {
        uVar27 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar28 = vcmpps_avx512vl(auVar89,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar125 & ((byte)uVar28 | (byte)uVar27)) != 0) goto LAB_01da1336;
        uVar27 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar79,5);
        uVar28 = vcmpps_avx512vl(auVar78,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar28 | (ushort)uVar27) & 1) == 0) goto LAB_01da1336;
        bVar11 = true;
        auVar262 = ZEXT1664(auVar260);
      }
      else {
LAB_01da1336:
        auVar80 = auVar270._0_16_;
        uVar27 = vcmpss_avx512f(auVar89,auVar80,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        iVar124 = auVar266._0_4_;
        fVar225 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        uVar27 = vcmpss_avx512f(auVar75,auVar80,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar226 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        bVar11 = fVar225 != fVar226;
        iVar269 = auVar270._0_4_;
        auVar112._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar111._4_60_ = auVar112._4_60_;
        auVar111._0_4_ = (uint)bVar11 * iVar269 + (uint)!bVar11 * 0x7f800000;
        auVar86 = auVar111._0_16_;
        auVar114._16_48_ = auVar112._16_48_;
        auVar114._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar113._4_60_ = auVar114._4_60_;
        auVar113._0_4_ = (uint)bVar11 * iVar269 + (uint)!bVar11 * -0x800000;
        auVar77 = auVar113._0_16_;
        uVar27 = vcmpss_avx512f(auVar78,auVar80,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar149 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        if ((fVar225 != fVar149) || (NAN(fVar225) || NAN(fVar149))) {
          fVar225 = auVar78._0_4_;
          bVar11 = fVar225 == fVar224;
          if ((!bVar11) || (NAN(fVar225) || NAN(fVar224))) {
            auVar89 = vxorps_avx512vl(auVar89,auVar265._0_16_);
            auVar255._0_4_ = auVar89._0_4_ / (fVar225 - fVar224);
            auVar255._4_12_ = auVar89._4_12_;
            auVar89 = vsubss_avx512f(auVar70,auVar255);
            auVar78 = vfmadd213ss_avx512f(auVar89,auVar80,auVar255);
            auVar89 = auVar78;
          }
          else {
            vucomiss_avx512f(auVar80);
            auVar116._16_48_ = auVar112._16_48_;
            auVar116._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar115._4_60_ = auVar116._4_60_;
            auVar115._0_4_ = (uint)bVar11 * iVar269 + (uint)!bVar11 * 0x7f800000;
            auVar78 = auVar115._0_16_;
            auVar89 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar86 = vminss_avx(auVar86,auVar78);
          auVar77 = vmaxss_avx(auVar89,auVar77);
        }
        uVar27 = vcmpss_avx512f(auVar79,auVar80,1);
        bVar11 = (bool)((byte)uVar27 & 1);
        fVar224 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar124);
        if ((fVar226 != fVar224) || (NAN(fVar226) || NAN(fVar224))) {
          bVar11 = fVar211 == fVar125;
          if ((!bVar11) || (NAN(fVar211) || NAN(fVar125))) {
            auVar75 = vxorps_avx512vl(auVar75,auVar265._0_16_);
            auVar217._0_4_ = auVar75._0_4_ / (fVar211 - fVar125);
            auVar217._4_12_ = auVar75._4_12_;
            auVar75 = vsubss_avx512f(auVar70,auVar217);
            auVar79 = vfmadd213ss_avx512f(auVar75,auVar80,auVar217);
            auVar75 = auVar79;
          }
          else {
            vucomiss_avx512f(auVar80);
            auVar118._16_48_ = auVar112._16_48_;
            auVar118._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar117._4_60_ = auVar118._4_60_;
            auVar117._0_4_ = (uint)bVar11 * iVar269 + (uint)!bVar11 * 0x7f800000;
            auVar79 = auVar117._0_16_;
            auVar75 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar86 = vminss_avx(auVar86,auVar79);
          auVar77 = vmaxss_avx(auVar75,auVar77);
        }
        bVar11 = fVar149 != fVar224;
        auVar75 = vminss_avx512f(auVar86,auVar70);
        auVar120._16_48_ = auVar112._16_48_;
        auVar120._0_16_ = auVar86;
        auVar119._4_60_ = auVar120._4_60_;
        auVar119._0_4_ = (uint)bVar11 * auVar75._0_4_ + (uint)!bVar11 * auVar86._0_4_;
        auVar75 = vmaxss_avx512f(auVar70,auVar77);
        auVar122._16_48_ = auVar112._16_48_;
        auVar122._0_16_ = auVar77;
        auVar121._4_60_ = auVar122._4_60_;
        auVar121._0_4_ = (uint)bVar11 * auVar75._0_4_ + (uint)!bVar11 * auVar77._0_4_;
        auVar75 = vmaxss_avx512f(auVar80,auVar119._0_16_);
        auVar79 = vminss_avx512f(auVar121._0_16_,auVar70);
        bVar11 = true;
        if (auVar75._0_4_ <= auVar79._0_4_) {
          auVar80 = vmaxss_avx512f(auVar80,ZEXT416((uint)(auVar75._0_4_ + -0.1)));
          auVar81 = vminss_avx512f(ZEXT416((uint)(auVar79._0_4_ + 0.1)),auVar70);
          auVar134._0_8_ = auVar84._0_8_;
          auVar134._8_8_ = auVar134._0_8_;
          auVar207._8_8_ = auVar169._0_8_;
          auVar207._0_8_ = auVar169._0_8_;
          auVar218._8_8_ = auVar179._0_8_;
          auVar218._0_8_ = auVar179._0_8_;
          auVar75 = vshufpd_avx(auVar169,auVar169,3);
          auVar79 = vshufpd_avx(auVar179,auVar179,3);
          auVar77 = vshufps_avx(auVar80,auVar81,0);
          auVar82 = vsubps_avx512vl(auVar71,auVar77);
          fVar125 = auVar77._0_4_;
          auVar249._0_4_ = fVar125 * auVar87._0_4_;
          fVar211 = auVar77._4_4_;
          auVar249._4_4_ = fVar211 * auVar87._4_4_;
          fVar224 = auVar77._8_4_;
          auVar249._8_4_ = fVar224 * auVar87._8_4_;
          fVar225 = auVar77._12_4_;
          auVar249._12_4_ = fVar225 * auVar87._12_4_;
          auVar170._0_4_ = fVar125 * auVar75._0_4_;
          auVar170._4_4_ = fVar211 * auVar75._4_4_;
          auVar170._8_4_ = fVar224 * auVar75._8_4_;
          auVar170._12_4_ = fVar225 * auVar75._12_4_;
          auVar174._0_4_ = fVar125 * auVar79._0_4_;
          auVar174._4_4_ = fVar211 * auVar79._4_4_;
          auVar174._8_4_ = fVar224 * auVar79._8_4_;
          auVar174._12_4_ = fVar225 * auVar79._12_4_;
          auVar154._0_4_ = fVar125 * auVar85._0_4_;
          auVar154._4_4_ = fVar211 * auVar85._4_4_;
          auVar154._8_4_ = fVar224 * auVar85._8_4_;
          auVar154._12_4_ = fVar225 * auVar85._12_4_;
          auVar89 = vfmadd231ps_fma(auVar249,auVar82,auVar134);
          auVar78 = vfmadd231ps_fma(auVar170,auVar82,auVar207);
          auVar86 = vfmadd231ps_fma(auVar174,auVar82,auVar218);
          auVar87 = vfmadd231ps_fma(auVar154,auVar82,ZEXT816(0));
          auVar75 = vsubss_avx512f(auVar70,auVar80);
          auVar79 = vmovshdup_avx512vl(auVar260);
          auVar83 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar79._0_4_ * auVar80._0_4_)),auVar260,
                                        auVar75);
          auVar75 = vsubss_avx512f(auVar70,auVar81);
          auVar84 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar81._0_4_ * auVar79._0_4_)),auVar260,
                                        auVar75);
          auVar85 = vdivss_avx512f(auVar70,auVar64);
          auVar64 = vsubps_avx(auVar78,auVar89);
          auVar189 = auVar127._0_16_;
          auVar79 = vmulps_avx512vl(auVar64,auVar189);
          auVar64 = vsubps_avx(auVar86,auVar78);
          auVar77 = vmulps_avx512vl(auVar64,auVar189);
          auVar64 = vsubps_avx(auVar87,auVar86);
          auVar64 = vmulps_avx512vl(auVar64,auVar189);
          auVar75 = vminps_avx(auVar77,auVar64);
          auVar64 = vmaxps_avx(auVar77,auVar64);
          auVar75 = vminps_avx(auVar79,auVar75);
          auVar64 = vmaxps_avx(auVar79,auVar64);
          auVar79 = vshufpd_avx(auVar75,auVar75,3);
          auVar77 = vshufpd_avx(auVar64,auVar64,3);
          auVar75 = vminps_avx(auVar75,auVar79);
          auVar64 = vmaxps_avx(auVar64,auVar77);
          fVar125 = auVar85._0_4_;
          auVar194._0_4_ = fVar125 * auVar75._0_4_;
          auVar194._4_4_ = fVar125 * auVar75._4_4_;
          auVar194._8_4_ = fVar125 * auVar75._8_4_;
          auVar194._12_4_ = fVar125 * auVar75._12_4_;
          auVar182._0_4_ = fVar125 * auVar64._0_4_;
          auVar182._4_4_ = fVar125 * auVar64._4_4_;
          auVar182._8_4_ = fVar125 * auVar64._8_4_;
          auVar182._12_4_ = fVar125 * auVar64._12_4_;
          auVar85 = vdivss_avx512f(auVar70,ZEXT416((uint)(auVar84._0_4_ - auVar83._0_4_)));
          auVar64 = vshufpd_avx(auVar89,auVar89,3);
          auVar75 = vshufpd_avx(auVar78,auVar78,3);
          auVar79 = vshufpd_avx(auVar86,auVar86,3);
          auVar77 = vshufpd_avx(auVar87,auVar87,3);
          auVar64 = vsubps_avx(auVar64,auVar89);
          auVar89 = vsubps_avx(auVar75,auVar78);
          auVar78 = vsubps_avx(auVar79,auVar86);
          auVar77 = vsubps_avx(auVar77,auVar87);
          auVar75 = vminps_avx(auVar64,auVar89);
          auVar64 = vmaxps_avx(auVar64,auVar89);
          auVar79 = vminps_avx(auVar78,auVar77);
          auVar79 = vminps_avx(auVar75,auVar79);
          auVar75 = vmaxps_avx(auVar78,auVar77);
          auVar64 = vmaxps_avx(auVar64,auVar75);
          fVar125 = auVar85._0_4_;
          auVar219._0_4_ = fVar125 * auVar79._0_4_;
          auVar219._4_4_ = fVar125 * auVar79._4_4_;
          auVar219._8_4_ = fVar125 * auVar79._8_4_;
          auVar219._12_4_ = fVar125 * auVar79._12_4_;
          auVar229._0_4_ = fVar125 * auVar64._0_4_;
          auVar229._4_4_ = fVar125 * auVar64._4_4_;
          auVar229._8_4_ = fVar125 * auVar64._8_4_;
          auVar229._12_4_ = fVar125 * auVar64._12_4_;
          auVar179 = vinsertps_avx512f(auVar63,auVar83,0x10);
          auVar89 = vinsertps_avx(auVar76,auVar84,0x10);
          auVar126._0_4_ = auVar179._0_4_ + auVar89._0_4_;
          auVar126._4_4_ = auVar179._4_4_ + auVar89._4_4_;
          auVar126._8_4_ = auVar179._8_4_ + auVar89._8_4_;
          auVar126._12_4_ = auVar179._12_4_ + auVar89._12_4_;
          auVar29._8_4_ = 0x3f000000;
          auVar29._0_8_ = 0x3f0000003f000000;
          auVar29._12_4_ = 0x3f000000;
          auVar81 = vmulps_avx512vl(auVar126,auVar29);
          auVar79 = vshufps_avx(auVar81,auVar81,0x54);
          uVar130 = auVar81._0_4_;
          auVar144._4_4_ = uVar130;
          auVar144._0_4_ = uVar130;
          auVar144._8_4_ = uVar130;
          auVar144._12_4_ = uVar130;
          auVar75 = vfmadd213ps_fma(auVar62,auVar144,auVar3);
          auVar78 = vfmadd213ps_avx512vl(auVar73,auVar144,auVar72);
          auVar77 = vfmadd213ps_fma(auVar74,auVar144,auVar68);
          auVar64 = vsubps_avx(auVar78,auVar75);
          auVar75 = vfmadd213ps_fma(auVar64,auVar144,auVar75);
          auVar64 = vsubps_avx(auVar77,auVar78);
          auVar64 = vfmadd213ps_fma(auVar64,auVar144,auVar78);
          auVar64 = vsubps_avx(auVar64,auVar75);
          auVar75 = vfmadd231ps_fma(auVar75,auVar64,auVar144);
          auVar86 = vmulps_avx512vl(auVar64,auVar189);
          auVar238._8_8_ = auVar75._0_8_;
          auVar238._0_8_ = auVar75._0_8_;
          auVar64 = vshufpd_avx(auVar75,auVar75,3);
          auVar75 = vshufps_avx(auVar81,auVar81,0x55);
          auVar77 = vsubps_avx(auVar64,auVar238);
          auVar78 = vfmadd231ps_fma(auVar238,auVar75,auVar77);
          auVar256._8_8_ = auVar86._0_8_;
          auVar256._0_8_ = auVar86._0_8_;
          auVar64 = vshufpd_avx(auVar86,auVar86,3);
          auVar64 = vsubps_avx(auVar64,auVar256);
          auVar75 = vfmadd213ps_fma(auVar64,auVar75,auVar256);
          auVar145._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
          auVar145._8_4_ = auVar77._8_4_ ^ 0x80000000;
          auVar145._12_4_ = auVar77._12_4_ ^ 0x80000000;
          auVar64 = vmovshdup_avx(auVar75);
          auVar257._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
          auVar257._8_4_ = auVar64._8_4_ ^ 0x80000000;
          auVar257._12_4_ = auVar64._12_4_ ^ 0x80000000;
          auVar86 = vmovshdup_avx512vl(auVar77);
          auVar87 = vpermt2ps_avx512vl(auVar257,ZEXT416(5),auVar77);
          auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar64._0_4_ * auVar77._0_4_)),auVar75,
                                        auVar86);
          auVar75 = vpermt2ps_avx512vl(auVar75,SUB6416(ZEXT464(4),0),auVar145);
          auVar155._0_4_ = auVar64._0_4_;
          auVar155._4_4_ = auVar155._0_4_;
          auVar155._8_4_ = auVar155._0_4_;
          auVar155._12_4_ = auVar155._0_4_;
          auVar64 = vdivps_avx(auVar87,auVar155);
          auVar75 = vdivps_avx(auVar75,auVar155);
          fVar211 = auVar78._0_4_;
          auVar77 = vshufps_avx(auVar78,auVar78,0x55);
          fVar125 = auVar75._0_4_;
          auVar239._0_4_ = fVar211 * auVar64._0_4_ + auVar77._0_4_ * fVar125;
          auVar239._4_4_ = fVar211 * auVar64._4_4_ + auVar77._4_4_ * auVar75._4_4_;
          auVar239._8_4_ = fVar211 * auVar64._8_4_ + auVar77._8_4_ * auVar75._8_4_;
          auVar239._12_4_ = fVar211 * auVar64._12_4_ + auVar77._12_4_ * auVar75._12_4_;
          auVar82 = vsubps_avx(auVar79,auVar239);
          auVar78 = vmovshdup_avx(auVar64);
          auVar79 = vinsertps_avx(auVar194,auVar219,0x1c);
          auVar258._0_4_ = auVar78._0_4_ * auVar79._0_4_;
          auVar258._4_4_ = auVar78._4_4_ * auVar79._4_4_;
          auVar258._8_4_ = auVar78._8_4_ * auVar79._8_4_;
          auVar258._12_4_ = auVar78._12_4_ * auVar79._12_4_;
          auVar77 = vinsertps_avx(auVar182,auVar229,0x1c);
          auVar240._0_4_ = auVar78._0_4_ * auVar77._0_4_;
          auVar240._4_4_ = auVar78._4_4_ * auVar77._4_4_;
          auVar240._8_4_ = auVar78._8_4_ * auVar77._8_4_;
          auVar240._12_4_ = auVar78._12_4_ * auVar77._12_4_;
          auVar80 = vminps_avx512vl(auVar258,auVar240);
          auVar87 = vmaxps_avx(auVar240,auVar258);
          auVar85 = vmovshdup_avx(auVar75);
          auVar78 = vinsertps_avx(auVar219,auVar194,0x4c);
          auVar220._0_4_ = auVar85._0_4_ * auVar78._0_4_;
          auVar220._4_4_ = auVar85._4_4_ * auVar78._4_4_;
          auVar220._8_4_ = auVar85._8_4_ * auVar78._8_4_;
          auVar220._12_4_ = auVar85._12_4_ * auVar78._12_4_;
          auVar86 = vinsertps_avx(auVar229,auVar182,0x4c);
          auVar230._0_4_ = auVar85._0_4_ * auVar86._0_4_;
          auVar230._4_4_ = auVar85._4_4_ * auVar86._4_4_;
          auVar230._8_4_ = auVar85._8_4_ * auVar86._8_4_;
          auVar230._12_4_ = auVar85._12_4_ * auVar86._12_4_;
          auVar85 = vminps_avx(auVar220,auVar230);
          auVar80 = vaddps_avx512vl(auVar80,auVar85);
          auVar85 = vmaxps_avx(auVar230,auVar220);
          auVar221._0_4_ = auVar87._0_4_ + auVar85._0_4_;
          auVar221._4_4_ = auVar87._4_4_ + auVar85._4_4_;
          auVar221._8_4_ = auVar87._8_4_ + auVar85._8_4_;
          auVar221._12_4_ = auVar87._12_4_ + auVar85._12_4_;
          auVar231._8_8_ = 0x3f80000000000000;
          auVar231._0_8_ = 0x3f80000000000000;
          auVar87 = vsubps_avx(auVar231,auVar221);
          auVar85 = vsubps_avx(auVar231,auVar80);
          auVar80 = vsubps_avx(auVar179,auVar81);
          auVar81 = vsubps_avx(auVar89,auVar81);
          fVar149 = auVar80._0_4_;
          auVar259._0_4_ = fVar149 * auVar87._0_4_;
          fVar227 = auVar80._4_4_;
          auVar259._4_4_ = fVar227 * auVar87._4_4_;
          fVar246 = auVar80._8_4_;
          auVar259._8_4_ = fVar246 * auVar87._8_4_;
          fVar247 = auVar80._12_4_;
          auVar259._12_4_ = fVar247 * auVar87._12_4_;
          auVar88 = vbroadcastss_avx512vl(auVar64);
          auVar79 = vmulps_avx512vl(auVar88,auVar79);
          auVar77 = vmulps_avx512vl(auVar88,auVar77);
          auVar88 = vminps_avx512vl(auVar79,auVar77);
          auVar79 = vmaxps_avx(auVar77,auVar79);
          auVar195._0_4_ = fVar125 * auVar78._0_4_;
          auVar195._4_4_ = fVar125 * auVar78._4_4_;
          auVar195._8_4_ = fVar125 * auVar78._8_4_;
          auVar195._12_4_ = fVar125 * auVar78._12_4_;
          auVar183._0_4_ = fVar125 * auVar86._0_4_;
          auVar183._4_4_ = fVar125 * auVar86._4_4_;
          auVar183._8_4_ = fVar125 * auVar86._8_4_;
          auVar183._12_4_ = fVar125 * auVar86._12_4_;
          auVar77 = vminps_avx(auVar195,auVar183);
          auVar78 = vaddps_avx512vl(auVar88,auVar77);
          auVar86 = vmulps_avx512vl(auVar80,auVar85);
          fVar211 = auVar81._0_4_;
          auVar222._0_4_ = fVar211 * auVar87._0_4_;
          fVar224 = auVar81._4_4_;
          auVar222._4_4_ = fVar224 * auVar87._4_4_;
          fVar225 = auVar81._8_4_;
          auVar222._8_4_ = fVar225 * auVar87._8_4_;
          fVar226 = auVar81._12_4_;
          auVar222._12_4_ = fVar226 * auVar87._12_4_;
          auVar232._0_4_ = fVar211 * auVar85._0_4_;
          auVar232._4_4_ = fVar224 * auVar85._4_4_;
          auVar232._8_4_ = fVar225 * auVar85._8_4_;
          auVar232._12_4_ = fVar226 * auVar85._12_4_;
          auVar77 = vmaxps_avx(auVar183,auVar195);
          auVar184._0_4_ = auVar79._0_4_ + auVar77._0_4_;
          auVar184._4_4_ = auVar79._4_4_ + auVar77._4_4_;
          auVar184._8_4_ = auVar79._8_4_ + auVar77._8_4_;
          auVar184._12_4_ = auVar79._12_4_ + auVar77._12_4_;
          auVar196._8_8_ = 0x3f800000;
          auVar196._0_8_ = 0x3f800000;
          auVar79 = vsubps_avx(auVar196,auVar184);
          auVar77 = vsubps_avx(auVar196,auVar78);
          auVar250._0_4_ = fVar149 * auVar79._0_4_;
          auVar250._4_4_ = fVar227 * auVar79._4_4_;
          auVar250._8_4_ = fVar246 * auVar79._8_4_;
          auVar250._12_4_ = fVar247 * auVar79._12_4_;
          auVar241._0_4_ = fVar149 * auVar77._0_4_;
          auVar241._4_4_ = fVar227 * auVar77._4_4_;
          auVar241._8_4_ = fVar246 * auVar77._8_4_;
          auVar241._12_4_ = fVar247 * auVar77._12_4_;
          auVar185._0_4_ = fVar211 * auVar79._0_4_;
          auVar185._4_4_ = fVar224 * auVar79._4_4_;
          auVar185._8_4_ = fVar225 * auVar79._8_4_;
          auVar185._12_4_ = fVar226 * auVar79._12_4_;
          auVar197._0_4_ = fVar211 * auVar77._0_4_;
          auVar197._4_4_ = fVar224 * auVar77._4_4_;
          auVar197._8_4_ = fVar225 * auVar77._8_4_;
          auVar197._12_4_ = fVar226 * auVar77._12_4_;
          auVar79 = vminps_avx(auVar250,auVar241);
          auVar77 = vminps_avx(auVar185,auVar197);
          auVar78 = vminps_avx(auVar79,auVar77);
          auVar79 = vmaxps_avx(auVar241,auVar250);
          auVar77 = vmaxps_avx(auVar197,auVar185);
          auVar77 = vmaxps_avx(auVar77,auVar79);
          auVar87 = vminps_avx512vl(auVar259,auVar86);
          auVar79 = vminps_avx(auVar222,auVar232);
          auVar79 = vminps_avx(auVar87,auVar79);
          auVar79 = vhaddps_avx(auVar78,auVar79);
          auVar86 = vmaxps_avx512vl(auVar86,auVar259);
          auVar78 = vmaxps_avx(auVar232,auVar222);
          auVar78 = vmaxps_avx(auVar78,auVar86);
          auVar77 = vhaddps_avx(auVar77,auVar78);
          auVar79 = vshufps_avx(auVar79,auVar79,0xe8);
          auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
          auVar186._0_4_ = auVar79._0_4_ + auVar82._0_4_;
          auVar186._4_4_ = auVar79._4_4_ + auVar82._4_4_;
          auVar186._8_4_ = auVar79._8_4_ + auVar82._8_4_;
          auVar186._12_4_ = auVar79._12_4_ + auVar82._12_4_;
          auVar198._0_4_ = auVar77._0_4_ + auVar82._0_4_;
          auVar198._4_4_ = auVar77._4_4_ + auVar82._4_4_;
          auVar198._8_4_ = auVar77._8_4_ + auVar82._8_4_;
          auVar198._12_4_ = auVar77._12_4_ + auVar82._12_4_;
          auVar79 = vmaxps_avx(auVar179,auVar186);
          auVar77 = vminps_avx(auVar198,auVar89);
          uVar58 = vcmpps_avx512vl(auVar77,auVar79,1);
          local_600 = vinsertps_avx(auVar83,auVar84,0x10);
          auVar262 = ZEXT1664(local_600);
          auVar79 = ZEXT416(5);
          if ((uVar58 & 3) == 0) {
            vucomiss_avx512f(auVar63);
            auVar79 = vxorps_avx512vl(auVar79,auVar79);
            auVar270 = ZEXT1664(auVar79);
            if ((uint)uVar54 < 4 && (uVar6 == 0 || lVar59 == 0)) {
              bVar11 = false;
            }
            else {
              lVar59 = 200;
              do {
                auVar77 = vsubss_avx512f(auVar70,auVar82);
                fVar225 = auVar77._0_4_;
                fVar211 = fVar225 * fVar225 * fVar225;
                fVar226 = auVar82._0_4_;
                fVar224 = fVar226 * 3.0 * fVar225 * fVar225;
                fVar225 = fVar225 * fVar226 * fVar226 * 3.0;
                auVar171._4_4_ = fVar211;
                auVar171._0_4_ = fVar211;
                auVar171._8_4_ = fVar211;
                auVar171._12_4_ = fVar211;
                auVar163._4_4_ = fVar224;
                auVar163._0_4_ = fVar224;
                auVar163._8_4_ = fVar224;
                auVar163._12_4_ = fVar224;
                auVar135._4_4_ = fVar225;
                auVar135._0_4_ = fVar225;
                auVar135._8_4_ = fVar225;
                auVar135._12_4_ = fVar225;
                fVar226 = fVar226 * fVar226 * fVar226;
                auVar175._0_4_ = (float)local_5e0._0_4_ * fVar226;
                auVar175._4_4_ = (float)local_5e0._4_4_ * fVar226;
                auVar175._8_4_ = fStack_5d8 * fVar226;
                auVar175._12_4_ = fStack_5d4 * fVar226;
                auVar77 = vfmadd231ps_fma(auVar175,auVar68,auVar135);
                auVar77 = vfmadd231ps_fma(auVar77,auVar72,auVar163);
                auVar77 = vfmadd231ps_fma(auVar77,auVar3,auVar171);
                auVar136._8_8_ = auVar77._0_8_;
                auVar136._0_8_ = auVar77._0_8_;
                auVar77 = vshufpd_avx(auVar77,auVar77,3);
                auVar89 = vshufps_avx(auVar82,auVar82,0x55);
                auVar77 = vsubps_avx(auVar77,auVar136);
                auVar89 = vfmadd213ps_fma(auVar77,auVar89,auVar136);
                fVar211 = auVar89._0_4_;
                auVar77 = vshufps_avx(auVar89,auVar89,0x55);
                auVar137._0_4_ = auVar64._0_4_ * fVar211 + fVar125 * auVar77._0_4_;
                auVar137._4_4_ = auVar64._4_4_ * fVar211 + auVar75._4_4_ * auVar77._4_4_;
                auVar137._8_4_ = auVar64._8_4_ * fVar211 + auVar75._8_4_ * auVar77._8_4_;
                auVar137._12_4_ = auVar64._12_4_ * fVar211 + auVar75._12_4_ * auVar77._12_4_;
                auVar82 = vsubps_avx(auVar82,auVar137);
                auVar77 = vandps_avx512vl(auVar89,auVar264._0_16_);
                auVar89 = vprolq_avx512vl(auVar77,0x20);
                auVar77 = vmaxss_avx(auVar89,auVar77);
                bVar26 = auVar77._0_4_ <= (float)local_5f0._0_4_;
                if (auVar77._0_4_ < (float)local_5f0._0_4_) {
                  auVar64 = vucomiss_avx512f(auVar79);
                  if (bVar26) {
                    auVar70 = vucomiss_avx512f(auVar64);
                    auVar266 = ZEXT1664(auVar70);
                    if (bVar26) {
                      vmovshdup_avx(auVar64);
                      auVar70 = vucomiss_avx512f(auVar79);
                      if (bVar26) {
                        auVar75 = vucomiss_avx512f(auVar70);
                        auVar266 = ZEXT1664(auVar75);
                        if (bVar26) {
                          auVar77 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar81 = vinsertps_avx(auVar77,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar77 = vdpps_avx(auVar81,local_470,0x7f);
                          auVar89 = vdpps_avx(auVar81,local_480,0x7f);
                          auVar78 = vdpps_avx(auVar81,local_490,0x7f);
                          auVar86 = vdpps_avx(auVar81,local_4a0,0x7f);
                          auVar87 = vdpps_avx(auVar81,local_4b0,0x7f);
                          auVar85 = vdpps_avx(auVar81,local_4c0,0x7f);
                          auVar80 = vdpps_avx(auVar81,local_4d0,0x7f);
                          auVar81 = vdpps_avx(auVar81,local_4e0,0x7f);
                          auVar82 = vsubss_avx512f(auVar75,auVar70);
                          fVar226 = auVar70._0_4_;
                          auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar87._0_4_)),auVar82
                                                    ,auVar77);
                          auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ * fVar226)),auVar82
                                                    ,auVar89);
                          auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar226)),auVar82
                                                    ,auVar78);
                          auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar81._0_4_)),auVar82
                                                    ,auVar86);
                          auVar75 = vsubss_avx512f(auVar75,auVar64);
                          auVar187._0_4_ = auVar75._0_4_;
                          fVar125 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
                          fVar225 = auVar64._0_4_;
                          fVar211 = fVar225 * 3.0 * auVar187._0_4_ * auVar187._0_4_;
                          fVar224 = auVar187._0_4_ * fVar225 * fVar225 * 3.0;
                          fVar227 = fVar225 * fVar225 * fVar225;
                          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar78._0_4_)),
                                                    ZEXT416((uint)fVar224),auVar89);
                          auVar75 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar211),auVar77);
                          auVar70 = vfmadd231ss_fma(auVar75,ZEXT416((uint)fVar125),auVar70);
                          fVar149 = auVar70._0_4_;
                          if ((fVar150 <= fVar149) &&
                             (fVar246 = *(float *)(ray + k * 4 + 0x200), fVar149 <= fVar246)) {
                            auVar70 = vshufps_avx(auVar64,auVar64,0x55);
                            auVar77 = vsubps_avx512vl(auVar71,auVar70);
                            fVar247 = auVar70._0_4_;
                            auVar223._0_4_ = fVar247 * (float)local_500._0_4_;
                            fVar252 = auVar70._4_4_;
                            auVar223._4_4_ = fVar252 * (float)local_500._4_4_;
                            fVar253 = auVar70._8_4_;
                            auVar223._8_4_ = fVar253 * fStack_4f8;
                            fVar254 = auVar70._12_4_;
                            auVar223._12_4_ = fVar254 * fStack_4f4;
                            auVar233._0_4_ = fVar247 * (float)local_550._0_4_;
                            auVar233._4_4_ = fVar252 * (float)local_550._4_4_;
                            auVar233._8_4_ = fVar253 * fStack_548;
                            auVar233._12_4_ = fVar254 * fStack_544;
                            auVar242._0_4_ = fVar247 * (float)local_560._0_4_;
                            auVar242._4_4_ = fVar252 * (float)local_560._4_4_;
                            auVar242._8_4_ = fVar253 * fStack_558;
                            auVar242._12_4_ = fVar254 * fStack_554;
                            auVar199._0_4_ = fVar247 * (float)local_520._0_4_;
                            auVar199._4_4_ = fVar252 * (float)local_520._4_4_;
                            auVar199._8_4_ = fVar253 * fStack_518;
                            auVar199._12_4_ = fVar254 * fStack_514;
                            auVar71 = vfmadd231ps_fma(auVar223,auVar77,local_4f0);
                            auVar70 = vfmadd231ps_fma(auVar233,auVar77,local_530);
                            auVar75 = vfmadd231ps_fma(auVar242,auVar77,local_540);
                            auVar77 = vfmadd231ps_fma(auVar199,auVar77,local_510);
                            auVar71 = vsubps_avx(auVar70,auVar71);
                            auVar70 = vsubps_avx(auVar75,auVar70);
                            auVar75 = vsubps_avx(auVar77,auVar75);
                            auVar243._0_4_ = fVar225 * auVar70._0_4_;
                            auVar243._4_4_ = fVar225 * auVar70._4_4_;
                            auVar243._8_4_ = fVar225 * auVar70._8_4_;
                            auVar243._12_4_ = fVar225 * auVar70._12_4_;
                            auVar187._4_4_ = auVar187._0_4_;
                            auVar187._8_4_ = auVar187._0_4_;
                            auVar187._12_4_ = auVar187._0_4_;
                            auVar71 = vfmadd231ps_fma(auVar243,auVar187,auVar71);
                            auVar200._0_4_ = fVar225 * auVar75._0_4_;
                            auVar200._4_4_ = fVar225 * auVar75._4_4_;
                            auVar200._8_4_ = fVar225 * auVar75._8_4_;
                            auVar200._12_4_ = fVar225 * auVar75._12_4_;
                            auVar70 = vfmadd231ps_fma(auVar200,auVar187,auVar70);
                            auVar201._0_4_ = fVar225 * auVar70._0_4_;
                            auVar201._4_4_ = fVar225 * auVar70._4_4_;
                            auVar201._8_4_ = fVar225 * auVar70._8_4_;
                            auVar201._12_4_ = fVar225 * auVar70._12_4_;
                            auVar71 = vfmadd231ps_fma(auVar201,auVar187,auVar71);
                            auVar71 = vmulps_avx512vl(auVar71,auVar189);
                            pGVar7 = (context->scene->geometries).items[uVar61].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                              auVar176._0_4_ = fVar227 * (float)local_5a0._0_4_;
                              auVar176._4_4_ = fVar227 * (float)local_5a0._4_4_;
                              auVar176._8_4_ = fVar227 * fStack_598;
                              auVar176._12_4_ = fVar227 * fStack_594;
                              auVar172._4_4_ = fVar224;
                              auVar172._0_4_ = fVar224;
                              auVar172._8_4_ = fVar224;
                              auVar172._12_4_ = fVar224;
                              auVar70 = vfmadd132ps_fma(auVar172,auVar176,local_590);
                              auVar164._4_4_ = fVar211;
                              auVar164._0_4_ = fVar211;
                              auVar164._8_4_ = fVar211;
                              auVar164._12_4_ = fVar211;
                              auVar70 = vfmadd132ps_fma(auVar164,auVar70,local_580);
                              auVar156._4_4_ = fVar125;
                              auVar156._0_4_ = fVar125;
                              auVar156._8_4_ = fVar125;
                              auVar156._12_4_ = fVar125;
                              auVar77 = vfmadd132ps_fma(auVar156,auVar70,local_570);
                              auVar70 = vshufps_avx(auVar77,auVar77,0xc9);
                              auVar75 = vshufps_avx(auVar71,auVar71,0xc9);
                              auVar157._0_4_ = auVar77._0_4_ * auVar75._0_4_;
                              auVar157._4_4_ = auVar77._4_4_ * auVar75._4_4_;
                              auVar157._8_4_ = auVar77._8_4_ * auVar75._8_4_;
                              auVar157._12_4_ = auVar77._12_4_ * auVar75._12_4_;
                              auVar71 = vfmsub231ps_fma(auVar157,auVar71,auVar70);
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x200) = fVar149;
                                uVar130 = vextractps_avx(auVar71,1);
                                *(undefined4 *)(ray + k * 4 + 0x300) = uVar130;
                                uVar130 = vextractps_avx(auVar71,2);
                                *(undefined4 *)(ray + k * 4 + 0x340) = uVar130;
                                *(int *)(ray + k * 4 + 0x380) = auVar71._0_4_;
                                *(float *)(ray + k * 4 + 0x3c0) = fVar225;
                                *(float *)(ray + k * 4 + 0x400) = fVar226;
                                *(uint *)(ray + k * 4 + 0x440) = uVar5;
                                *(uint *)(ray + k * 4 + 0x480) = uVar61;
                                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                              }
                              else {
                                local_200 = vbroadcastss_avx512f(auVar64);
                                auVar127 = vbroadcastss_avx512f(ZEXT416(1));
                                local_1c0 = vpermps_avx512f(auVar127,ZEXT1664(auVar64));
                                auVar127 = vpermps_avx512f(auVar127,ZEXT1664(auVar71));
                                auVar123 = vbroadcastss_avx512f(ZEXT416(2));
                                local_280 = vpermps_avx512f(auVar123,ZEXT1664(auVar71));
                                local_240 = vbroadcastss_avx512f(auVar71);
                                local_2c0[0] = (RTCHitN)auVar127[0];
                                local_2c0[1] = (RTCHitN)auVar127[1];
                                local_2c0[2] = (RTCHitN)auVar127[2];
                                local_2c0[3] = (RTCHitN)auVar127[3];
                                local_2c0[4] = (RTCHitN)auVar127[4];
                                local_2c0[5] = (RTCHitN)auVar127[5];
                                local_2c0[6] = (RTCHitN)auVar127[6];
                                local_2c0[7] = (RTCHitN)auVar127[7];
                                local_2c0[8] = (RTCHitN)auVar127[8];
                                local_2c0[9] = (RTCHitN)auVar127[9];
                                local_2c0[10] = (RTCHitN)auVar127[10];
                                local_2c0[0xb] = (RTCHitN)auVar127[0xb];
                                local_2c0[0xc] = (RTCHitN)auVar127[0xc];
                                local_2c0[0xd] = (RTCHitN)auVar127[0xd];
                                local_2c0[0xe] = (RTCHitN)auVar127[0xe];
                                local_2c0[0xf] = (RTCHitN)auVar127[0xf];
                                local_2c0[0x10] = (RTCHitN)auVar127[0x10];
                                local_2c0[0x11] = (RTCHitN)auVar127[0x11];
                                local_2c0[0x12] = (RTCHitN)auVar127[0x12];
                                local_2c0[0x13] = (RTCHitN)auVar127[0x13];
                                local_2c0[0x14] = (RTCHitN)auVar127[0x14];
                                local_2c0[0x15] = (RTCHitN)auVar127[0x15];
                                local_2c0[0x16] = (RTCHitN)auVar127[0x16];
                                local_2c0[0x17] = (RTCHitN)auVar127[0x17];
                                local_2c0[0x18] = (RTCHitN)auVar127[0x18];
                                local_2c0[0x19] = (RTCHitN)auVar127[0x19];
                                local_2c0[0x1a] = (RTCHitN)auVar127[0x1a];
                                local_2c0[0x1b] = (RTCHitN)auVar127[0x1b];
                                local_2c0[0x1c] = (RTCHitN)auVar127[0x1c];
                                local_2c0[0x1d] = (RTCHitN)auVar127[0x1d];
                                local_2c0[0x1e] = (RTCHitN)auVar127[0x1e];
                                local_2c0[0x1f] = (RTCHitN)auVar127[0x1f];
                                local_2c0[0x20] = (RTCHitN)auVar127[0x20];
                                local_2c0[0x21] = (RTCHitN)auVar127[0x21];
                                local_2c0[0x22] = (RTCHitN)auVar127[0x22];
                                local_2c0[0x23] = (RTCHitN)auVar127[0x23];
                                local_2c0[0x24] = (RTCHitN)auVar127[0x24];
                                local_2c0[0x25] = (RTCHitN)auVar127[0x25];
                                local_2c0[0x26] = (RTCHitN)auVar127[0x26];
                                local_2c0[0x27] = (RTCHitN)auVar127[0x27];
                                local_2c0[0x28] = (RTCHitN)auVar127[0x28];
                                local_2c0[0x29] = (RTCHitN)auVar127[0x29];
                                local_2c0[0x2a] = (RTCHitN)auVar127[0x2a];
                                local_2c0[0x2b] = (RTCHitN)auVar127[0x2b];
                                local_2c0[0x2c] = (RTCHitN)auVar127[0x2c];
                                local_2c0[0x2d] = (RTCHitN)auVar127[0x2d];
                                local_2c0[0x2e] = (RTCHitN)auVar127[0x2e];
                                local_2c0[0x2f] = (RTCHitN)auVar127[0x2f];
                                local_2c0[0x30] = (RTCHitN)auVar127[0x30];
                                local_2c0[0x31] = (RTCHitN)auVar127[0x31];
                                local_2c0[0x32] = (RTCHitN)auVar127[0x32];
                                local_2c0[0x33] = (RTCHitN)auVar127[0x33];
                                local_2c0[0x34] = (RTCHitN)auVar127[0x34];
                                local_2c0[0x35] = (RTCHitN)auVar127[0x35];
                                local_2c0[0x36] = (RTCHitN)auVar127[0x36];
                                local_2c0[0x37] = (RTCHitN)auVar127[0x37];
                                local_2c0[0x38] = (RTCHitN)auVar127[0x38];
                                local_2c0[0x39] = (RTCHitN)auVar127[0x39];
                                local_2c0[0x3a] = (RTCHitN)auVar127[0x3a];
                                local_2c0[0x3b] = (RTCHitN)auVar127[0x3b];
                                local_2c0[0x3c] = (RTCHitN)auVar127[0x3c];
                                local_2c0[0x3d] = (RTCHitN)auVar127[0x3d];
                                local_2c0[0x3e] = (RTCHitN)auVar127[0x3e];
                                local_2c0[0x3f] = (RTCHitN)auVar127[0x3f];
                                local_180 = local_340._0_8_;
                                uStack_178 = local_340._8_8_;
                                uStack_170 = local_340._16_8_;
                                uStack_168 = local_340._24_8_;
                                uStack_160 = local_340._32_8_;
                                uStack_158 = local_340._40_8_;
                                uStack_150 = local_340._48_8_;
                                uStack_148 = local_340._56_8_;
                                auVar127 = vmovdqa64_avx512f(local_300);
                                local_140 = vmovdqa64_avx512f(auVar127);
                                vpcmpeqd_avx2(auVar127._0_32_,auVar127._0_32_);
                                local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                                local_c0 = vbroadcastss_avx512f
                                                     (ZEXT416(context->user->instPrimID[0]));
                                *(float *)(ray + k * 4 + 0x200) = fVar149;
                                local_440 = local_380;
                                local_630.valid = (int *)local_440;
                                local_630.geometryUserPtr = pGVar7->userPtr;
                                local_630.context = context->user;
                                local_630.hit = local_2c0;
                                local_630.N = 0x10;
                                local_630.ray = (RTCRayN *)ray;
                                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar7->intersectionFilterN)(&local_630);
                                  auVar262 = ZEXT1664(local_600);
                                  auVar71 = vxorps_avx512vl(auVar79,auVar79);
                                  auVar270 = ZEXT1664(auVar71);
                                  auVar266 = ZEXT464(0x3f800000);
                                  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar263 = ZEXT3264(auVar95);
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar265 = ZEXT1664(auVar71);
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar264 = ZEXT1664(auVar71);
                                  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar268 = ZEXT3264(auVar95);
                                }
                                auVar71 = auVar270._0_16_;
                                auVar127 = vmovdqa64_avx512f(local_440);
                                auVar112._16_48_ = auVar127._16_48_;
                                uVar27 = vptestmd_avx512f(auVar127,auVar127);
                                if ((short)uVar27 == 0) {
LAB_01da21fd:
                                  *(float *)(ray + k * 4 + 0x200) = fVar246;
                                }
                                else {
                                  p_Var10 = context->args->filter;
                                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var10)(&local_630);
                                    auVar262 = ZEXT1664(local_600);
                                    auVar71 = vxorps_avx512vl(auVar71,auVar71);
                                    auVar270 = ZEXT1664(auVar71);
                                    auVar266 = ZEXT464(0x3f800000);
                                    auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar263 = ZEXT3264(auVar95);
                                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar265 = ZEXT1664(auVar71);
                                    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar264 = ZEXT1664(auVar71);
                                    auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
                                    auVar268 = ZEXT3264(auVar95);
                                  }
                                  auVar127 = vmovdqa64_avx512f(local_440);
                                  auVar112._16_48_ = auVar127._16_48_;
                                  uVar58 = vptestmd_avx512f(auVar127,auVar127);
                                  if ((short)uVar58 == 0) goto LAB_01da21fd;
                                  iVar124 = *(int *)(local_630.hit + 4);
                                  iVar269 = *(int *)(local_630.hit + 8);
                                  iVar39 = *(int *)(local_630.hit + 0xc);
                                  iVar40 = *(int *)(local_630.hit + 0x10);
                                  iVar41 = *(int *)(local_630.hit + 0x14);
                                  iVar42 = *(int *)(local_630.hit + 0x18);
                                  iVar43 = *(int *)(local_630.hit + 0x1c);
                                  iVar44 = *(int *)(local_630.hit + 0x20);
                                  iVar45 = *(int *)(local_630.hit + 0x24);
                                  iVar46 = *(int *)(local_630.hit + 0x28);
                                  iVar47 = *(int *)(local_630.hit + 0x2c);
                                  iVar48 = *(int *)(local_630.hit + 0x30);
                                  iVar49 = *(int *)(local_630.hit + 0x34);
                                  iVar50 = *(int *)(local_630.hit + 0x38);
                                  iVar51 = *(int *)(local_630.hit + 0x3c);
                                  bVar52 = (byte)uVar58;
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar58 >> 7) & 1);
                                  bVar18 = (byte)(uVar58 >> 8);
                                  bVar19 = (bool)((byte)(uVar58 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar58 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar58 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x300) =
                                       (uint)(bVar52 & 1) * *(int *)local_630.hit |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x300);
                                  *(uint *)(local_630.ray + 0x304) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x304);
                                  *(uint *)(local_630.ray + 0x308) =
                                       (uint)bVar12 * iVar269 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x308);
                                  *(uint *)(local_630.ray + 0x30c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x30c);
                                  *(uint *)(local_630.ray + 0x310) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x310);
                                  *(uint *)(local_630.ray + 0x314) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x314);
                                  *(uint *)(local_630.ray + 0x318) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x318);
                                  *(uint *)(local_630.ray + 0x31c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x31c);
                                  *(uint *)(local_630.ray + 800) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 800);
                                  *(uint *)(local_630.ray + 0x324) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x324);
                                  *(uint *)(local_630.ray + 0x328) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x328);
                                  *(uint *)(local_630.ray + 0x32c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x32c);
                                  *(uint *)(local_630.ray + 0x330) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x330);
                                  *(uint *)(local_630.ray + 0x334) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x334);
                                  *(uint *)(local_630.ray + 0x338) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x338);
                                  *(uint *)(local_630.ray + 0x33c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x33c);
                                  iVar124 = *(int *)(local_630.hit + 0x44);
                                  iVar269 = *(int *)(local_630.hit + 0x48);
                                  iVar39 = *(int *)(local_630.hit + 0x4c);
                                  iVar40 = *(int *)(local_630.hit + 0x50);
                                  iVar41 = *(int *)(local_630.hit + 0x54);
                                  iVar42 = *(int *)(local_630.hit + 0x58);
                                  iVar43 = *(int *)(local_630.hit + 0x5c);
                                  iVar44 = *(int *)(local_630.hit + 0x60);
                                  iVar45 = *(int *)(local_630.hit + 100);
                                  iVar46 = *(int *)(local_630.hit + 0x68);
                                  iVar47 = *(int *)(local_630.hit + 0x6c);
                                  iVar48 = *(int *)(local_630.hit + 0x70);
                                  iVar49 = *(int *)(local_630.hit + 0x74);
                                  iVar50 = *(int *)(local_630.hit + 0x78);
                                  iVar51 = *(int *)(local_630.hit + 0x7c);
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar58 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar58 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar58 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar58 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x340) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x40) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x340);
                                  *(uint *)(local_630.ray + 0x344) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x344);
                                  *(uint *)(local_630.ray + 0x348) =
                                       (uint)bVar12 * iVar269 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x348);
                                  *(uint *)(local_630.ray + 0x34c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x34c);
                                  *(uint *)(local_630.ray + 0x350) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x350);
                                  *(uint *)(local_630.ray + 0x354) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x354);
                                  *(uint *)(local_630.ray + 0x358) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x358);
                                  *(uint *)(local_630.ray + 0x35c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x35c);
                                  *(uint *)(local_630.ray + 0x360) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x360);
                                  *(uint *)(local_630.ray + 0x364) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x364);
                                  *(uint *)(local_630.ray + 0x368) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x368);
                                  *(uint *)(local_630.ray + 0x36c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x36c);
                                  *(uint *)(local_630.ray + 0x370) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x370);
                                  *(uint *)(local_630.ray + 0x374) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x374);
                                  *(uint *)(local_630.ray + 0x378) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x378);
                                  *(uint *)(local_630.ray + 0x37c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x37c);
                                  iVar124 = *(int *)(local_630.hit + 0x84);
                                  iVar269 = *(int *)(local_630.hit + 0x88);
                                  iVar39 = *(int *)(local_630.hit + 0x8c);
                                  iVar40 = *(int *)(local_630.hit + 0x90);
                                  iVar41 = *(int *)(local_630.hit + 0x94);
                                  iVar42 = *(int *)(local_630.hit + 0x98);
                                  iVar43 = *(int *)(local_630.hit + 0x9c);
                                  iVar44 = *(int *)(local_630.hit + 0xa0);
                                  iVar45 = *(int *)(local_630.hit + 0xa4);
                                  iVar46 = *(int *)(local_630.hit + 0xa8);
                                  iVar47 = *(int *)(local_630.hit + 0xac);
                                  iVar48 = *(int *)(local_630.hit + 0xb0);
                                  iVar49 = *(int *)(local_630.hit + 0xb4);
                                  iVar50 = *(int *)(local_630.hit + 0xb8);
                                  iVar51 = *(int *)(local_630.hit + 0xbc);
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar58 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar58 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar58 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar58 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x380) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x80) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x380);
                                  *(uint *)(local_630.ray + 900) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 900);
                                  *(uint *)(local_630.ray + 0x388) =
                                       (uint)bVar12 * iVar269 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x388);
                                  *(uint *)(local_630.ray + 0x38c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x38c);
                                  *(uint *)(local_630.ray + 0x390) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x390);
                                  *(uint *)(local_630.ray + 0x394) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x394);
                                  *(uint *)(local_630.ray + 0x398) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x398);
                                  *(uint *)(local_630.ray + 0x39c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x39c);
                                  *(uint *)(local_630.ray + 0x3a0) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x3a0);
                                  *(uint *)(local_630.ray + 0x3a4) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x3a4);
                                  *(uint *)(local_630.ray + 0x3a8) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x3a8);
                                  *(uint *)(local_630.ray + 0x3ac) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x3ac);
                                  *(uint *)(local_630.ray + 0x3b0) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x3b0);
                                  *(uint *)(local_630.ray + 0x3b4) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x3b4);
                                  *(uint *)(local_630.ray + 0x3b8) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x3b8);
                                  *(uint *)(local_630.ray + 0x3bc) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x3bc);
                                  iVar124 = *(int *)(local_630.hit + 0xc4);
                                  iVar269 = *(int *)(local_630.hit + 200);
                                  iVar39 = *(int *)(local_630.hit + 0xcc);
                                  iVar40 = *(int *)(local_630.hit + 0xd0);
                                  iVar41 = *(int *)(local_630.hit + 0xd4);
                                  iVar42 = *(int *)(local_630.hit + 0xd8);
                                  iVar43 = *(int *)(local_630.hit + 0xdc);
                                  iVar44 = *(int *)(local_630.hit + 0xe0);
                                  iVar45 = *(int *)(local_630.hit + 0xe4);
                                  iVar46 = *(int *)(local_630.hit + 0xe8);
                                  iVar47 = *(int *)(local_630.hit + 0xec);
                                  iVar48 = *(int *)(local_630.hit + 0xf0);
                                  iVar49 = *(int *)(local_630.hit + 0xf4);
                                  iVar50 = *(int *)(local_630.hit + 0xf8);
                                  iVar51 = *(int *)(local_630.hit + 0xfc);
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar58 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar58 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar58 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar58 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x3c0) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0xc0) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x3c0);
                                  *(uint *)(local_630.ray + 0x3c4) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x3c4);
                                  *(uint *)(local_630.ray + 0x3c8) =
                                       (uint)bVar12 * iVar269 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x3c8);
                                  *(uint *)(local_630.ray + 0x3cc) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x3cc);
                                  *(uint *)(local_630.ray + 0x3d0) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x3d0);
                                  *(uint *)(local_630.ray + 0x3d4) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x3d4);
                                  *(uint *)(local_630.ray + 0x3d8) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x3d8);
                                  *(uint *)(local_630.ray + 0x3dc) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x3dc);
                                  *(uint *)(local_630.ray + 0x3e0) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x3e0);
                                  *(uint *)(local_630.ray + 0x3e4) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x3e4);
                                  *(uint *)(local_630.ray + 1000) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 1000);
                                  *(uint *)(local_630.ray + 0x3ec) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x3ec);
                                  *(uint *)(local_630.ray + 0x3f0) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x3f0);
                                  *(uint *)(local_630.ray + 0x3f4) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x3f4);
                                  *(uint *)(local_630.ray + 0x3f8) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x3f8);
                                  *(uint *)(local_630.ray + 0x3fc) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x3fc);
                                  iVar124 = *(int *)(local_630.hit + 0x104);
                                  iVar269 = *(int *)(local_630.hit + 0x108);
                                  iVar39 = *(int *)(local_630.hit + 0x10c);
                                  iVar40 = *(int *)(local_630.hit + 0x110);
                                  iVar41 = *(int *)(local_630.hit + 0x114);
                                  iVar42 = *(int *)(local_630.hit + 0x118);
                                  iVar43 = *(int *)(local_630.hit + 0x11c);
                                  iVar44 = *(int *)(local_630.hit + 0x120);
                                  iVar45 = *(int *)(local_630.hit + 0x124);
                                  iVar46 = *(int *)(local_630.hit + 0x128);
                                  iVar47 = *(int *)(local_630.hit + 300);
                                  iVar48 = *(int *)(local_630.hit + 0x130);
                                  iVar49 = *(int *)(local_630.hit + 0x134);
                                  iVar50 = *(int *)(local_630.hit + 0x138);
                                  iVar51 = *(int *)(local_630.hit + 0x13c);
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  bVar12 = (bool)((byte)(uVar58 >> 2) & 1);
                                  bVar13 = (bool)((byte)(uVar58 >> 3) & 1);
                                  bVar14 = (bool)((byte)(uVar58 >> 4) & 1);
                                  bVar15 = (bool)((byte)(uVar58 >> 5) & 1);
                                  bVar16 = (bool)((byte)(uVar58 >> 6) & 1);
                                  bVar17 = (bool)((byte)(uVar58 >> 7) & 1);
                                  bVar19 = (bool)((byte)(uVar58 >> 9) & 1);
                                  bVar20 = (bool)((byte)(uVar58 >> 10) & 1);
                                  bVar21 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  bVar22 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  bVar23 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  bVar24 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  bVar25 = SUB81(uVar58 >> 0xf,0);
                                  *(uint *)(local_630.ray + 0x400) =
                                       (uint)(bVar52 & 1) * *(int *)(local_630.hit + 0x100) |
                                       (uint)!(bool)(bVar52 & 1) * *(int *)(local_630.ray + 0x400);
                                  *(uint *)(local_630.ray + 0x404) =
                                       (uint)bVar26 * iVar124 |
                                       (uint)!bVar26 * *(int *)(local_630.ray + 0x404);
                                  *(uint *)(local_630.ray + 0x408) =
                                       (uint)bVar12 * iVar269 |
                                       (uint)!bVar12 * *(int *)(local_630.ray + 0x408);
                                  *(uint *)(local_630.ray + 0x40c) =
                                       (uint)bVar13 * iVar39 |
                                       (uint)!bVar13 * *(int *)(local_630.ray + 0x40c);
                                  *(uint *)(local_630.ray + 0x410) =
                                       (uint)bVar14 * iVar40 |
                                       (uint)!bVar14 * *(int *)(local_630.ray + 0x410);
                                  *(uint *)(local_630.ray + 0x414) =
                                       (uint)bVar15 * iVar41 |
                                       (uint)!bVar15 * *(int *)(local_630.ray + 0x414);
                                  *(uint *)(local_630.ray + 0x418) =
                                       (uint)bVar16 * iVar42 |
                                       (uint)!bVar16 * *(int *)(local_630.ray + 0x418);
                                  *(uint *)(local_630.ray + 0x41c) =
                                       (uint)bVar17 * iVar43 |
                                       (uint)!bVar17 * *(int *)(local_630.ray + 0x41c);
                                  *(uint *)(local_630.ray + 0x420) =
                                       (uint)(bVar18 & 1) * iVar44 |
                                       (uint)!(bool)(bVar18 & 1) * *(int *)(local_630.ray + 0x420);
                                  *(uint *)(local_630.ray + 0x424) =
                                       (uint)bVar19 * iVar45 |
                                       (uint)!bVar19 * *(int *)(local_630.ray + 0x424);
                                  *(uint *)(local_630.ray + 0x428) =
                                       (uint)bVar20 * iVar46 |
                                       (uint)!bVar20 * *(int *)(local_630.ray + 0x428);
                                  *(uint *)(local_630.ray + 0x42c) =
                                       (uint)bVar21 * iVar47 |
                                       (uint)!bVar21 * *(int *)(local_630.ray + 0x42c);
                                  *(uint *)(local_630.ray + 0x430) =
                                       (uint)bVar22 * iVar48 |
                                       (uint)!bVar22 * *(int *)(local_630.ray + 0x430);
                                  *(uint *)(local_630.ray + 0x434) =
                                       (uint)bVar23 * iVar49 |
                                       (uint)!bVar23 * *(int *)(local_630.ray + 0x434);
                                  *(uint *)(local_630.ray + 0x438) =
                                       (uint)bVar24 * iVar50 |
                                       (uint)!bVar24 * *(int *)(local_630.ray + 0x438);
                                  *(uint *)(local_630.ray + 0x43c) =
                                       (uint)bVar25 * iVar51 |
                                       (uint)!bVar25 * *(int *)(local_630.ray + 0x43c);
                                  auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x140));
                                  auVar127 = vmovdqu32_avx512f(auVar127);
                                  *(undefined1 (*) [64])(local_630.ray + 0x440) = auVar127;
                                  auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x180));
                                  auVar127 = vmovdqu32_avx512f(auVar127);
                                  *(undefined1 (*) [64])(local_630.ray + 0x480) = auVar127;
                                  auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x1c0));
                                  auVar127 = vmovdqa32_avx512f(auVar123);
                                  *(undefined1 (*) [64])(local_630.ray + 0x4c0) = auVar127;
                                  auVar127 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                                (local_630.hit + 0x200));
                                  bVar26 = (bool)((byte)(uVar58 >> 1) & 1);
                                  auVar38._4_56_ = auVar127._8_56_;
                                  auVar38._0_4_ =
                                       (uint)bVar26 * auVar127._4_4_ |
                                       (uint)!bVar26 * auVar123._4_4_;
                                  auVar267._0_8_ = auVar38._0_8_ << 0x20;
                                  bVar26 = (bool)((byte)(uVar58 >> 2) & 1);
                                  auVar267._8_4_ =
                                       (uint)bVar26 * auVar127._8_4_ |
                                       (uint)!bVar26 * auVar123._8_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 3) & 1);
                                  auVar267._12_4_ =
                                       (uint)bVar26 * auVar127._12_4_ |
                                       (uint)!bVar26 * auVar123._12_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 4) & 1);
                                  auVar267._16_4_ =
                                       (uint)bVar26 * auVar127._16_4_ |
                                       (uint)!bVar26 * auVar123._16_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 5) & 1);
                                  auVar267._20_4_ =
                                       (uint)bVar26 * auVar127._20_4_ |
                                       (uint)!bVar26 * auVar123._20_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 6) & 1);
                                  auVar267._24_4_ =
                                       (uint)bVar26 * auVar127._24_4_ |
                                       (uint)!bVar26 * auVar123._24_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 7) & 1);
                                  auVar267._28_4_ =
                                       (uint)bVar26 * auVar127._28_4_ |
                                       (uint)!bVar26 * auVar123._28_4_;
                                  auVar267._32_4_ =
                                       (uint)(bVar18 & 1) * auVar127._32_4_ |
                                       (uint)!(bool)(bVar18 & 1) * auVar123._32_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 9) & 1);
                                  auVar267._36_4_ =
                                       (uint)bVar26 * auVar127._36_4_ |
                                       (uint)!bVar26 * auVar123._36_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 10) & 1);
                                  auVar267._40_4_ =
                                       (uint)bVar26 * auVar127._40_4_ |
                                       (uint)!bVar26 * auVar123._40_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 0xb) & 1);
                                  auVar267._44_4_ =
                                       (uint)bVar26 * auVar127._44_4_ |
                                       (uint)!bVar26 * auVar123._44_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 0xc) & 1);
                                  auVar267._48_4_ =
                                       (uint)bVar26 * auVar127._48_4_ |
                                       (uint)!bVar26 * auVar123._48_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 0xd) & 1);
                                  auVar267._52_4_ =
                                       (uint)bVar26 * auVar127._52_4_ |
                                       (uint)!bVar26 * auVar123._52_4_;
                                  bVar26 = (bool)((byte)(uVar58 >> 0xe) & 1);
                                  auVar267._56_4_ =
                                       (uint)bVar26 * auVar127._56_4_ |
                                       (uint)!bVar26 * auVar123._56_4_;
                                  bVar26 = SUB81(uVar58 >> 0xf,0);
                                  auVar267._60_4_ =
                                       (uint)bVar26 * auVar127._60_4_ |
                                       (uint)!bVar26 * auVar123._60_4_;
                                  auVar112._16_48_ = auVar267._16_48_;
                                  auVar127 = vmovdqa32_avx512f(auVar127);
                                  *(undefined1 (*) [64])(local_630.ray + 0x500) = auVar127;
                                }
                                auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar127 = ZEXT1664(auVar71);
                                auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar267 = ZEXT1664(auVar71);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar59 = lVar59 + -1;
              } while (lVar59 != 0);
            }
          }
          else {
            auVar71 = vxorps_avx512vl(ZEXT416(5),auVar79);
            auVar270 = ZEXT1664(auVar71);
          }
        }
        else {
          auVar262 = ZEXT1664(auVar260);
        }
      }
      auVar123._32_32_ = auVar112._32_32_;
    } while (bVar11);
    auVar71 = vinsertps_avx512f(auVar63,auVar76,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }